

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_n<embree::sse2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined8 *puVar2;
  undefined1 (*pauVar3) [12];
  Primitive *pPVar4;
  Primitive PVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  void *pvVar9;
  __int_type_conflict _Var10;
  long lVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined6 uVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  RTCFilterFunctionN p_Var41;
  RTCRayN *pRVar42;
  int iVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  bool bVar47;
  uint uVar48;
  uint uVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  short sVar53;
  float t1;
  float fVar54;
  float fVar55;
  undefined2 uVar86;
  float fVar87;
  float fVar89;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  float fVar88;
  float fVar90;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar91;
  float fVar104;
  float fVar105;
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar106;
  float fVar123;
  float fVar124;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  float fVar137;
  float fVar138;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  float fVar139;
  float fVar144;
  float fVar145;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar146;
  float fVar160;
  float fVar161;
  vfloat4 a;
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar173;
  float fVar174;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar175;
  float fVar194;
  float fVar195;
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar196;
  float fVar207;
  float fVar208;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar209;
  float fVar216;
  float fVar217;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar218;
  float fVar223;
  float fVar224;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar225;
  undefined1 auVar222 [16];
  float fVar226;
  float fVar227;
  float fVar235;
  float fVar237;
  vfloat4 a_1;
  undefined1 auVar228 [16];
  float fVar239;
  undefined1 auVar231 [16];
  float fVar238;
  float fVar240;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar236;
  undefined1 auVar234 [16];
  float fVar241;
  float fVar242;
  float fVar247;
  float fVar249;
  float fVar251;
  undefined1 auVar243 [16];
  float fVar248;
  float fVar250;
  float fVar252;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar253;
  float fVar258;
  float fVar259;
  undefined1 auVar254 [16];
  float fVar260;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar261;
  float fVar262;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_54d;
  uint local_54c;
  float fStack_540;
  float fStack_53c;
  undefined8 local_538;
  undefined8 local_528;
  float local_518;
  float fStack_514;
  float fStack_510;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_438;
  ulong local_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  uint auStack_328 [4];
  RTCFilterFunctionNArguments local_318;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  uint local_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined8 auStack_58 [5];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 uVar85;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar135 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  
  PVar5 = prim[1];
  uVar38 = (ulong)(byte)PVar5;
  pPVar4 = prim + uVar38 * 0x19 + 6;
  fVar124 = *(float *)(pPVar4 + 0xc);
  fVar125 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar124;
  fVar137 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar124;
  fVar138 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar124;
  fVar106 = *(float *)(ray + k * 4 + 0x40) * fVar124;
  fVar123 = *(float *)(ray + k * 4 + 0x50) * fVar124;
  fVar124 = *(float *)(ray + k * 4 + 0x60) * fVar124;
  uVar6 = *(undefined4 *)(prim + uVar38 * 4 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar22,sVar53);
  auVar153._8_4_ = 0;
  auVar153._0_8_ = uVar45;
  auVar153._12_2_ = uVar86;
  auVar153._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar152._12_4_ = auVar153._12_4_;
  auVar152._8_2_ = 0;
  auVar152._0_8_ = uVar45;
  auVar152._10_2_ = uVar86;
  auVar63._10_6_ = auVar152._10_6_;
  auVar63._8_2_ = uVar86;
  auVar63._0_8_ = uVar45;
  uVar86 = (undefined2)uVar22;
  auVar23._4_8_ = auVar63._8_8_;
  auVar23._2_2_ = uVar86;
  auVar23._0_2_ = uVar86;
  fVar91 = (float)((int)sVar53 >> 8);
  fVar104 = (float)(auVar23._0_4_ >> 0x18);
  fVar105 = (float)(auVar63._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar38 * 5 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar22,sVar53);
  auVar56._8_4_ = 0;
  auVar56._0_8_ = uVar45;
  auVar56._12_2_ = uVar86;
  auVar56._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar264._12_4_ = auVar56._12_4_;
  auVar264._8_2_ = 0;
  auVar264._0_8_ = uVar45;
  auVar264._10_2_ = uVar86;
  auVar110._10_6_ = auVar264._10_6_;
  auVar110._8_2_ = uVar86;
  auVar110._0_8_ = uVar45;
  uVar86 = (undefined2)uVar22;
  auVar24._4_8_ = auVar110._8_8_;
  auVar24._2_2_ = uVar86;
  auVar24._0_2_ = uVar86;
  fVar139 = (float)((int)sVar53 >> 8);
  fVar144 = (float)(auVar24._0_4_ >> 0x18);
  fVar145 = (float)(auVar110._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar38 * 6 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar22,sVar53);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar45;
  auVar59._12_2_ = uVar86;
  auVar59._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar45;
  auVar58._10_2_ = uVar86;
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._8_2_ = uVar86;
  auVar57._0_8_ = uVar45;
  uVar86 = (undefined2)uVar22;
  auVar25._4_8_ = auVar57._8_8_;
  auVar25._2_2_ = uVar86;
  auVar25._0_2_ = uVar86;
  fVar162 = (float)((int)sVar53 >> 8);
  fVar173 = (float)(auVar25._0_4_ >> 0x18);
  fVar174 = (float)(auVar57._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar38 * 0xb + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar22,sVar53);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar45;
  auVar62._12_2_ = uVar86;
  auVar62._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar45;
  auVar61._10_2_ = uVar86;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = uVar86;
  auVar60._0_8_ = uVar45;
  uVar86 = (undefined2)uVar22;
  auVar26._4_8_ = auVar60._8_8_;
  auVar26._2_2_ = uVar86;
  auVar26._0_2_ = uVar86;
  fVar54 = (float)((int)sVar53 >> 8);
  fVar87 = (float)(auVar26._0_4_ >> 0x18);
  fVar89 = (float)(auVar60._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar22,sVar53);
  auVar149._8_4_ = 0;
  auVar149._0_8_ = uVar45;
  auVar149._12_2_ = uVar86;
  auVar149._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._8_2_ = 0;
  auVar148._0_8_ = uVar45;
  auVar148._10_2_ = uVar86;
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._8_2_ = uVar86;
  auVar147._0_8_ = uVar45;
  uVar86 = (undefined2)uVar22;
  auVar27._4_8_ = auVar147._8_8_;
  auVar27._2_2_ = uVar86;
  auVar27._0_2_ = uVar86;
  fVar146 = (float)((int)sVar53 >> 8);
  fVar160 = (float)(auVar27._0_4_ >> 0x18);
  fVar161 = (float)(auVar147._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar38 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar22,sVar53);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar45;
  auVar178._12_2_ = uVar86;
  auVar178._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar45;
  auVar177._10_2_ = uVar86;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar86;
  auVar176._0_8_ = uVar45;
  uVar86 = (undefined2)uVar22;
  auVar28._4_8_ = auVar176._8_8_;
  auVar28._2_2_ = uVar86;
  auVar28._0_2_ = uVar86;
  fVar209 = (float)((int)sVar53 >> 8);
  fVar216 = (float)(auVar28._0_4_ >> 0x18);
  fVar217 = (float)(auVar176._8_4_ >> 0x18);
  uVar46 = (ulong)(uint)((int)(uVar38 * 9) * 2);
  uVar6 = *(undefined4 *)(prim + uVar46 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar22,sVar53);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar45;
  auVar181._12_2_ = uVar86;
  auVar181._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar45;
  auVar180._10_2_ = uVar86;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar86;
  auVar179._0_8_ = uVar45;
  uVar86 = (undefined2)uVar22;
  auVar29._4_8_ = auVar179._8_8_;
  auVar29._2_2_ = uVar86;
  auVar29._0_2_ = uVar86;
  fVar196 = (float)((int)sVar53 >> 8);
  fVar207 = (float)(auVar29._0_4_ >> 0x18);
  fVar208 = (float)(auVar179._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar46 + uVar38 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar22,sVar53);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar45;
  auVar184._12_2_ = uVar86;
  auVar184._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar45;
  auVar183._10_2_ = uVar86;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar86;
  auVar182._0_8_ = uVar45;
  uVar86 = (undefined2)uVar22;
  auVar30._4_8_ = auVar182._8_8_;
  auVar30._2_2_ = uVar86;
  auVar30._0_2_ = uVar86;
  fVar218 = (float)((int)sVar53 >> 8);
  fVar223 = (float)(auVar30._0_4_ >> 0x18);
  fVar224 = (float)(auVar182._8_4_ >> 0x18);
  uVar39 = (ulong)(uint)((int)(uVar38 * 5) << 2);
  uVar6 = *(undefined4 *)(prim + uVar39 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar22,sVar53);
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar45;
  auVar230._12_2_ = uVar86;
  auVar230._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar45;
  auVar229._10_2_ = uVar86;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._8_2_ = uVar86;
  auVar228._0_8_ = uVar45;
  uVar86 = (undefined2)uVar22;
  auVar31._4_8_ = auVar228._8_8_;
  auVar31._2_2_ = uVar86;
  auVar31._0_2_ = uVar86;
  fVar55 = (float)((int)sVar53 >> 8);
  fVar88 = (float)(auVar31._0_4_ >> 0x18);
  fVar90 = (float)(auVar228._8_4_ >> 0x18);
  fVar241 = fVar106 * fVar91 + fVar123 * fVar139 + fVar124 * fVar162;
  fVar247 = fVar106 * fVar104 + fVar123 * fVar144 + fVar124 * fVar173;
  fVar249 = fVar106 * fVar105 + fVar123 * fVar145 + fVar124 * fVar174;
  fVar251 = fVar106 * (float)(auVar152._12_4_ >> 0x18) +
            fVar123 * (float)(auVar264._12_4_ >> 0x18) + fVar124 * (float)(auVar58._12_4_ >> 0x18);
  fVar226 = fVar106 * fVar54 + fVar123 * fVar146 + fVar124 * fVar209;
  fVar235 = fVar106 * fVar87 + fVar123 * fVar160 + fVar124 * fVar216;
  fVar237 = fVar106 * fVar89 + fVar123 * fVar161 + fVar124 * fVar217;
  fVar239 = fVar106 * (float)(auVar61._12_4_ >> 0x18) +
            fVar123 * (float)(auVar148._12_4_ >> 0x18) + fVar124 * (float)(auVar177._12_4_ >> 0x18);
  fVar175 = fVar106 * fVar196 + fVar123 * fVar218 + fVar124 * fVar55;
  fVar194 = fVar106 * fVar207 + fVar123 * fVar223 + fVar124 * fVar88;
  fVar195 = fVar106 * fVar208 + fVar123 * fVar224 + fVar124 * fVar90;
  fVar106 = fVar106 * (float)(auVar180._12_4_ >> 0x18) +
            fVar123 * (float)(auVar183._12_4_ >> 0x18) + fVar124 * (float)(auVar229._12_4_ >> 0x18);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar139 = fVar91 * fVar125 + fVar139 * fVar137 + fVar162 * fVar138;
  fVar144 = fVar104 * fVar125 + fVar144 * fVar137 + fVar173 * fVar138;
  fVar145 = fVar105 * fVar125 + fVar145 * fVar137 + fVar174 * fVar138;
  fVar162 = (float)(auVar152._12_4_ >> 0x18) * fVar125 +
            (float)(auVar264._12_4_ >> 0x18) * fVar137 + (float)(auVar58._12_4_ >> 0x18) * fVar138;
  fVar173 = fVar54 * fVar125 + fVar146 * fVar137 + fVar209 * fVar138;
  fVar174 = fVar87 * fVar125 + fVar160 * fVar137 + fVar216 * fVar138;
  fVar209 = fVar89 * fVar125 + fVar161 * fVar137 + fVar217 * fVar138;
  fVar216 = (float)(auVar61._12_4_ >> 0x18) * fVar125 +
            (float)(auVar148._12_4_ >> 0x18) * fVar137 + (float)(auVar177._12_4_ >> 0x18) * fVar138;
  fVar146 = fVar125 * fVar196 + fVar137 * fVar218 + fVar138 * fVar55;
  fVar160 = fVar125 * fVar207 + fVar137 * fVar223 + fVar138 * fVar88;
  fVar161 = fVar125 * fVar208 + fVar137 * fVar224 + fVar138 * fVar90;
  fVar125 = fVar125 * (float)(auVar180._12_4_ >> 0x18) +
            fVar137 * (float)(auVar183._12_4_ >> 0x18) + fVar138 * (float)(auVar229._12_4_ >> 0x18);
  fVar124 = (float)DAT_01ff1d40;
  fVar54 = DAT_01ff1d40._4_4_;
  fVar55 = DAT_01ff1d40._8_4_;
  fVar87 = DAT_01ff1d40._12_4_;
  uVar48 = -(uint)(fVar124 <= ABS(fVar241));
  uVar49 = -(uint)(fVar54 <= ABS(fVar247));
  uVar51 = -(uint)(fVar55 <= ABS(fVar249));
  uVar52 = -(uint)(fVar87 <= ABS(fVar251));
  auVar243._0_4_ = (uint)fVar241 & uVar48;
  auVar243._4_4_ = (uint)fVar247 & uVar49;
  auVar243._8_4_ = (uint)fVar249 & uVar51;
  auVar243._12_4_ = (uint)fVar251 & uVar52;
  auVar140._0_4_ = ~uVar48 & (uint)fVar124;
  auVar140._4_4_ = ~uVar49 & (uint)fVar54;
  auVar140._8_4_ = ~uVar51 & (uint)fVar55;
  auVar140._12_4_ = ~uVar52 & (uint)fVar87;
  auVar140 = auVar140 | auVar243;
  uVar48 = -(uint)(fVar124 <= ABS(fVar226));
  uVar49 = -(uint)(fVar54 <= ABS(fVar235));
  uVar51 = -(uint)(fVar55 <= ABS(fVar237));
  uVar52 = -(uint)(fVar87 <= ABS(fVar239));
  auVar231._0_4_ = (uint)fVar226 & uVar48;
  auVar231._4_4_ = (uint)fVar235 & uVar49;
  auVar231._8_4_ = (uint)fVar237 & uVar51;
  auVar231._12_4_ = (uint)fVar239 & uVar52;
  auVar150._0_4_ = ~uVar48 & (uint)fVar124;
  auVar150._4_4_ = ~uVar49 & (uint)fVar54;
  auVar150._8_4_ = ~uVar51 & (uint)fVar55;
  auVar150._12_4_ = ~uVar52 & (uint)fVar87;
  auVar150 = auVar150 | auVar231;
  uVar48 = -(uint)(fVar124 <= ABS(fVar175));
  uVar49 = -(uint)(fVar54 <= ABS(fVar194));
  uVar51 = -(uint)(fVar55 <= ABS(fVar195));
  uVar52 = -(uint)(fVar87 <= ABS(fVar106));
  auVar185._0_4_ = (uint)fVar175 & uVar48;
  auVar185._4_4_ = (uint)fVar194 & uVar49;
  auVar185._8_4_ = (uint)fVar195 & uVar51;
  auVar185._12_4_ = (uint)fVar106 & uVar52;
  auVar163._0_4_ = ~uVar48 & (uint)fVar124;
  auVar163._4_4_ = ~uVar49 & (uint)fVar54;
  auVar163._8_4_ = ~uVar51 & (uint)fVar55;
  auVar163._12_4_ = ~uVar52 & (uint)fVar87;
  auVar163 = auVar163 | auVar185;
  auVar63 = rcpps(_DAT_01ff1d40,auVar140);
  fVar124 = auVar63._0_4_;
  fVar87 = auVar63._4_4_;
  fVar90 = auVar63._8_4_;
  fVar105 = auVar63._12_4_;
  fVar124 = (1.0 - auVar140._0_4_ * fVar124) * fVar124 + fVar124;
  fVar87 = (1.0 - auVar140._4_4_ * fVar87) * fVar87 + fVar87;
  fVar90 = (1.0 - auVar140._8_4_ * fVar90) * fVar90 + fVar90;
  fVar105 = (1.0 - auVar140._12_4_ * fVar105) * fVar105 + fVar105;
  auVar63 = rcpps(auVar63,auVar150);
  fVar54 = auVar63._0_4_;
  fVar88 = auVar63._4_4_;
  fVar91 = auVar63._8_4_;
  fVar106 = auVar63._12_4_;
  fVar54 = (1.0 - auVar150._0_4_ * fVar54) * fVar54 + fVar54;
  fVar88 = (1.0 - auVar150._4_4_ * fVar88) * fVar88 + fVar88;
  fVar91 = (1.0 - auVar150._8_4_ * fVar91) * fVar91 + fVar91;
  fVar106 = (1.0 - auVar150._12_4_ * fVar106) * fVar106 + fVar106;
  auVar63 = rcpps(auVar63,auVar163);
  fVar55 = auVar63._0_4_;
  fVar89 = auVar63._4_4_;
  fVar104 = auVar63._8_4_;
  fVar123 = auVar63._12_4_;
  fVar55 = (1.0 - auVar163._0_4_ * fVar55) * fVar55 + fVar55;
  fVar89 = (1.0 - auVar163._4_4_ * fVar89) * fVar89 + fVar89;
  fVar104 = (1.0 - auVar163._8_4_ * fVar104) * fVar104 + fVar104;
  fVar123 = (1.0 - auVar163._12_4_ * fVar123) * fVar123 + fVar123;
  uVar45 = *(ulong *)(prim + uVar38 * 7 + 6);
  uVar86 = (undefined2)(uVar45 >> 0x30);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar45;
  auVar66._12_2_ = uVar86;
  auVar66._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar45 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar45;
  auVar65._10_2_ = uVar86;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar86;
  auVar64._0_8_ = uVar45;
  uVar86 = (undefined2)(uVar45 >> 0x10);
  auVar32._4_8_ = auVar64._8_8_;
  auVar32._2_2_ = uVar86;
  auVar32._0_2_ = uVar86;
  auVar141._0_8_ =
       CONCAT44(((float)(auVar32._0_4_ >> 0x10) - fVar144) * fVar87,
                ((float)(int)(short)uVar45 - fVar139) * fVar124);
  auVar141._8_4_ = ((float)(auVar64._8_4_ >> 0x10) - fVar145) * fVar90;
  auVar141._12_4_ = ((float)(auVar65._12_4_ >> 0x10) - fVar162) * fVar105;
  uVar45 = *(ulong *)(prim + uVar38 * 9 + 6);
  uVar86 = (undefined2)(uVar45 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar45;
  auVar69._12_2_ = uVar86;
  auVar69._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar45 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar45;
  auVar68._10_2_ = uVar86;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar86;
  auVar67._0_8_ = uVar45;
  uVar86 = (undefined2)(uVar45 >> 0x10);
  auVar33._4_8_ = auVar67._8_8_;
  auVar33._2_2_ = uVar86;
  auVar33._0_2_ = uVar86;
  auVar164._0_4_ = ((float)(int)(short)uVar45 - fVar139) * fVar124;
  auVar164._4_4_ = ((float)(auVar33._0_4_ >> 0x10) - fVar144) * fVar87;
  auVar164._8_4_ = ((float)(auVar67._8_4_ >> 0x10) - fVar145) * fVar90;
  auVar164._12_4_ = ((float)(auVar68._12_4_ >> 0x10) - fVar162) * fVar105;
  uVar45 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar46 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar38 * -2 + 6);
  uVar86 = (undefined2)(uVar46 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar46;
  auVar94._12_2_ = uVar86;
  auVar94._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar46 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar46;
  auVar93._10_2_ = uVar86;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar86;
  auVar92._0_8_ = uVar46;
  uVar86 = (undefined2)(uVar46 >> 0x10);
  auVar34._4_8_ = auVar92._8_8_;
  auVar34._2_2_ = uVar86;
  auVar34._0_2_ = uVar86;
  auVar95._0_8_ =
       CONCAT44(((float)(auVar34._0_4_ >> 0x10) - fVar174) * fVar88,
                ((float)(int)(short)uVar46 - fVar173) * fVar54);
  auVar95._8_4_ = ((float)(auVar92._8_4_ >> 0x10) - fVar209) * fVar91;
  auVar95._12_4_ = ((float)(auVar93._12_4_ >> 0x10) - fVar216) * fVar106;
  uVar86 = (undefined2)(uVar45 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar45;
  auVar72._12_2_ = uVar86;
  auVar72._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar45 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar45;
  auVar71._10_2_ = uVar86;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar86;
  auVar70._0_8_ = uVar45;
  uVar86 = (undefined2)(uVar45 >> 0x10);
  auVar35._4_8_ = auVar70._8_8_;
  auVar35._2_2_ = uVar86;
  auVar35._0_2_ = uVar86;
  auVar197._0_4_ = ((float)(int)(short)uVar45 - fVar173) * fVar54;
  auVar197._4_4_ = ((float)(auVar35._0_4_ >> 0x10) - fVar174) * fVar88;
  auVar197._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar209) * fVar91;
  auVar197._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar216) * fVar106;
  uVar45 = *(ulong *)(prim + uVar39 + uVar38 + 6);
  uVar86 = (undefined2)(uVar45 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar45;
  auVar75._12_2_ = uVar86;
  auVar75._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar45 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar45;
  auVar74._10_2_ = uVar86;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar86;
  auVar73._0_8_ = uVar45;
  uVar86 = (undefined2)(uVar45 >> 0x10);
  auVar36._4_8_ = auVar73._8_8_;
  auVar36._2_2_ = uVar86;
  auVar36._0_2_ = uVar86;
  auVar76._0_8_ =
       CONCAT44(((float)(auVar36._0_4_ >> 0x10) - fVar160) * fVar89,
                ((float)(int)(short)uVar45 - fVar146) * fVar55);
  auVar76._8_4_ = ((float)(auVar73._8_4_ >> 0x10) - fVar161) * fVar104;
  auVar76._12_4_ = ((float)(auVar74._12_4_ >> 0x10) - fVar125) * fVar123;
  uVar45 = *(ulong *)(prim + uVar38 * 0x17 + 6);
  uVar86 = (undefined2)(uVar45 >> 0x30);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar45;
  auVar188._12_2_ = uVar86;
  auVar188._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar45 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar45;
  auVar187._10_2_ = uVar86;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar86;
  auVar186._0_8_ = uVar45;
  uVar86 = (undefined2)(uVar45 >> 0x10);
  auVar37._4_8_ = auVar186._8_8_;
  auVar37._2_2_ = uVar86;
  auVar37._0_2_ = uVar86;
  auVar189._0_4_ = ((float)(int)(short)uVar45 - fVar146) * fVar55;
  auVar189._4_4_ = ((float)(auVar37._0_4_ >> 0x10) - fVar160) * fVar89;
  auVar189._8_4_ = ((float)(auVar186._8_4_ >> 0x10) - fVar161) * fVar104;
  auVar189._12_4_ = ((float)(auVar187._12_4_ >> 0x10) - fVar125) * fVar123;
  auVar151._8_4_ = auVar141._8_4_;
  auVar151._0_8_ = auVar141._0_8_;
  auVar151._12_4_ = auVar141._12_4_;
  auVar152 = minps(auVar151,auVar164);
  auVar107._8_4_ = auVar95._8_4_;
  auVar107._0_8_ = auVar95._0_8_;
  auVar107._12_4_ = auVar95._12_4_;
  auVar63 = minps(auVar107,auVar197);
  auVar152 = maxps(auVar152,auVar63);
  auVar108._8_4_ = auVar76._8_4_;
  auVar108._0_8_ = auVar76._0_8_;
  auVar108._12_4_ = auVar76._12_4_;
  auVar63 = minps(auVar108,auVar189);
  auVar126._4_4_ = uVar6;
  auVar126._0_4_ = uVar6;
  auVar126._8_4_ = uVar6;
  auVar126._12_4_ = uVar6;
  auVar63 = maxps(auVar63,auVar126);
  auVar153 = maxps(auVar152,auVar63);
  auVar152 = maxps(auVar141,auVar164);
  auVar63 = maxps(auVar95,auVar197);
  auVar152 = minps(auVar152,auVar63);
  auVar63 = maxps(auVar76,auVar189);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar96._4_4_ = uVar6;
  auVar96._0_4_ = uVar6;
  auVar96._8_4_ = uVar6;
  auVar96._12_4_ = uVar6;
  auVar63 = minps(auVar63,auVar96);
  local_288 = auVar153._0_4_ * 0.99999964;
  fStack_284 = auVar153._4_4_ * 0.99999964;
  fStack_280 = auVar153._8_4_ * 0.99999964;
  fStack_27c = auVar153._12_4_ * 0.99999964;
  auVar63 = minps(auVar152,auVar63);
  auVar77._0_4_ = -(uint)(local_288 <= auVar63._0_4_ * 1.0000004 && PVar5 != (Primitive)0x0);
  auVar77._4_4_ = -(uint)(fStack_284 <= auVar63._4_4_ * 1.0000004 && 1 < (byte)PVar5);
  auVar77._8_4_ = -(uint)(fStack_280 <= auVar63._8_4_ * 1.0000004 && 2 < (byte)PVar5);
  auVar77._12_4_ = -(uint)(fStack_27c <= auVar63._12_4_ * 1.0000004 && 3 < (byte)PVar5);
  uVar48 = movmskps((uint)(byte)PVar5,auVar77);
  local_54d = uVar48 != 0;
  if (uVar48 == 0) {
    return local_54d;
  }
  uVar48 = uVar48 & 0xff;
  local_268._0_12_ = mm_lookupmask_ps._240_12_;
  local_268._12_4_ = 0;
  local_438 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_00b727a4:
  local_430 = (ulong)uVar48;
  lVar40 = 0;
  if (local_430 != 0) {
    for (; (uVar48 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
    }
  }
  uVar48 = *(uint *)(prim + 2);
  local_2e8 = *(uint *)(prim + lVar40 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar48].ptr;
  uVar45 = *(ulong *)&pGVar7->field_0x58;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar46 = (ulong)*(uint *)(uVar45 + _Var8 * local_2e8);
  p_Var41 = pGVar7[1].intersectionFilterN;
  pvVar9 = pGVar7[2].userPtr;
  _Var10 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var10 + uVar46 * (long)pvVar9);
  fVar124 = *pfVar1;
  fVar54 = pfVar1[1];
  fVar55 = pfVar1[2];
  fVar87 = pfVar1[3];
  puVar2 = (undefined8 *)(_Var10 + (uVar46 + 1) * (long)pvVar9);
  uVar19 = *puVar2;
  uVar20 = puVar2[1];
  local_4d8 = (float)uVar19;
  fStack_4d4 = (float)((ulong)uVar19 >> 0x20);
  fStack_4d0 = (float)uVar20;
  fStack_4cc = (float)((ulong)uVar20 >> 0x20);
  pfVar1 = (float *)(_Var10 + (uVar46 + 2) * (long)pvVar9);
  fVar88 = *pfVar1;
  fVar89 = pfVar1[1];
  fVar90 = pfVar1[2];
  fVar91 = pfVar1[3];
  pfVar1 = (float *)(_Var10 + (long)pvVar9 * (uVar46 + 3));
  fVar104 = *pfVar1;
  fVar105 = pfVar1[1];
  fVar106 = pfVar1[2];
  fVar123 = pfVar1[3];
  local_430 = local_430 - 1 & local_430;
  lVar40 = *(long *)&pGVar7[1].time_range.upper;
  pauVar3 = (undefined1 (*) [12])(lVar40 + (long)p_Var41 * uVar46);
  auVar23 = *pauVar3;
  fVar139 = *(float *)pauVar3[1];
  pfVar1 = (float *)(lVar40 + (long)p_Var41 * (uVar46 + 1));
  fVar144 = *pfVar1;
  fVar145 = pfVar1[1];
  fVar162 = pfVar1[2];
  fVar146 = pfVar1[3];
  pfVar1 = (float *)(lVar40 + (long)p_Var41 * (uVar46 + 2));
  fVar160 = *pfVar1;
  fVar161 = pfVar1[1];
  fVar125 = pfVar1[2];
  fVar137 = pfVar1[3];
  lVar11 = 0;
  if (local_430 != 0) {
    for (; (local_430 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  pfVar1 = (float *)(lVar40 + (long)p_Var41 * (uVar46 + 3));
  fVar138 = *pfVar1;
  fVar173 = pfVar1[1];
  fVar174 = pfVar1[2];
  fVar175 = pfVar1[3];
  if ((local_430 != 0) && (uVar46 = local_430 - 1 & local_430, uVar46 != 0)) {
    lVar40 = 0;
    if (uVar46 != 0) {
      for (; (uVar46 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
      }
    }
    uVar45 = (ulong)*(uint *)(uVar45 + _Var8 * *(uint *)(prim + lVar40 * 4 + 6));
  }
  local_1b8 = *(float *)(ray + k * 4);
  fStack_1b4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1b0 = *(float *)(ray + k * 4 + 0x20);
  fVar208 = (fVar160 * 0.5 + fVar138 * 0.0 + fVar144 * 0.0) - *(float *)*pauVar3 * 0.5;
  fVar209 = (fVar161 * 0.5 + fVar173 * 0.0 + fVar145 * 0.0) - *(float *)(*pauVar3 + 4) * 0.5;
  fVar216 = (fVar125 * 0.5 + fVar174 * 0.0 + fVar162 * 0.0) - *(float *)(*pauVar3 + 8) * 0.5;
  fVar217 = (fVar137 * 0.5 + fVar175 * 0.0 + fVar146 * 0.0) - fVar139 * 0.5;
  fVar235 = (fVar88 * 0.5 + fVar104 * 0.0 + local_4d8 * 0.0) - fVar124 * 0.5;
  fVar237 = (fVar89 * 0.5 + fVar105 * 0.0 + fStack_4d4 * 0.0) - fVar54 * 0.5;
  fVar239 = (fVar90 * 0.5 + fVar106 * 0.0 + fStack_4d0 * 0.0) - fVar55 * 0.5;
  fVar241 = (fVar91 * 0.5 + fVar123 * 0.0 + fStack_4cc * 0.0) - fVar87 * 0.5;
  fVar218 = *(float *)*pauVar3 * -0.0;
  fVar223 = *(float *)(*pauVar3 + 4) * -0.0;
  fVar224 = *(float *)(*pauVar3 + 8) * -0.0;
  fVar194 = fVar160 * 0.0 + fVar138 * -0.0 + fVar144 + fVar218;
  fVar195 = fVar161 * 0.0 + fVar173 * -0.0 + fVar145 + fVar223;
  fVar196 = fVar125 * 0.0 + fVar174 * -0.0 + fVar162 + fVar224;
  fVar207 = fVar137 * 0.0 + fVar175 * -0.0 + fVar146 + fVar139 * -0.0;
  fVar218 = fVar138 * -0.0 + fVar160 + fVar144 * 0.0 + fVar218;
  fVar223 = fVar173 * -0.0 + fVar161 + fVar145 * 0.0 + fVar223;
  fVar224 = fVar174 * -0.0 + fVar125 + fVar162 * 0.0 + fVar224;
  fVar226 = fVar175 * -0.0 + fVar137 + fVar146 * 0.0 + fVar139 * -0.0;
  fVar249 = fVar88 * 0.0 + fVar104 * -0.0 + local_4d8 + fVar124 * -0.0;
  fVar251 = fVar89 * 0.0 + fVar105 * -0.0 + fStack_4d4 + fVar54 * -0.0;
  fVar269 = fVar90 * 0.0 + fVar106 * -0.0 + fStack_4d0 + fVar55 * -0.0;
  fVar271 = fVar91 * 0.0 + fVar123 * -0.0 + fStack_4cc + fVar87 * -0.0;
  local_518 = auVar23._0_4_;
  fStack_514 = auVar23._4_4_;
  fStack_510 = auVar23._8_4_;
  fVar144 = local_518 * 0.0 + ((fVar138 * 0.5 + fVar160 * 0.0) - fVar144 * 0.5);
  fVar145 = fStack_514 * 0.0 + ((fVar173 * 0.5 + fVar161 * 0.0) - fVar145 * 0.5);
  fVar162 = fStack_510 * 0.0 + ((fVar174 * 0.5 + fVar125 * 0.0) - fVar162 * 0.5);
  fVar139 = fVar139 * 0.0 + ((fVar175 * 0.5 + fVar137 * 0.0) - fVar146 * 0.5);
  fVar146 = fVar104 * -0.0 + fVar88 + local_4d8 * 0.0 + fVar124 * -0.0;
  fVar160 = fVar105 * -0.0 + fVar89 + fStack_4d4 * 0.0 + fVar54 * -0.0;
  fVar161 = fVar106 * -0.0 + fVar90 + fStack_4d0 * 0.0 + fVar55 * -0.0;
  fVar125 = fVar123 * -0.0 + fVar91 + fStack_4cc * 0.0 + fVar87 * -0.0;
  fVar124 = fVar124 * 0.0 + ((fVar104 * 0.5 + fVar88 * 0.0) - local_4d8 * 0.5);
  fVar54 = fVar54 * 0.0 + ((fVar105 * 0.5 + fVar89 * 0.0) - fStack_4d4 * 0.5);
  fVar88 = fVar55 * 0.0 + ((fVar106 * 0.5 + fVar90 * 0.0) - fStack_4d0 * 0.5);
  fVar137 = fVar87 * 0.0 + ((fVar123 * 0.5 + fVar91 * 0.0) - fStack_4cc * 0.5);
  fVar247 = fVar209 * fVar249 - fVar251 * fVar208;
  fVar175 = fVar216 * fVar251 - fVar269 * fVar209;
  fVar249 = fVar208 * fVar269 - fVar249 * fVar216;
  fVar251 = fVar217 * fVar271 - fVar271 * fVar217;
  fVar90 = fVar209 * fVar235 - fVar237 * fVar208;
  fVar104 = fVar216 * fVar237 - fVar239 * fVar209;
  fVar105 = fVar208 * fVar239 - fVar235 * fVar216;
  fVar106 = fVar145 * fVar146 - fVar160 * fVar144;
  fVar160 = fVar162 * fVar160 - fVar161 * fVar145;
  fVar146 = fVar144 * fVar161 - fVar146 * fVar162;
  fVar161 = fVar139 * fVar125 - fVar125 * fVar139;
  fVar55 = fVar145 * fVar124 - fVar54 * fVar144;
  fVar54 = fVar162 * fVar54 - fVar88 * fVar145;
  fVar88 = fVar144 * fVar88 - fVar124 * fVar162;
  fVar138 = fVar249 * fVar249 + fVar175 * fVar175 + fVar247 * fVar247;
  auVar152 = ZEXT416((uint)fVar138);
  auVar63 = rsqrtss(ZEXT416((uint)fVar138),auVar152);
  fVar124 = auVar63._0_4_;
  fVar173 = fVar124 * 1.5 - fVar124 * fVar124 * fVar138 * 0.5 * fVar124;
  fVar239 = fVar247 * fVar90 + fVar249 * fVar105 + fVar175 * fVar104;
  fVar124 = fVar251 * fVar173;
  auVar63 = rcpss(auVar152,auVar152);
  fVar91 = (2.0 - fVar138 * auVar63._0_4_) * auVar63._0_4_;
  fVar125 = fVar146 * fVar146 + fVar160 * fVar160 + fVar106 * fVar106;
  auVar63 = ZEXT416((uint)fVar125);
  auVar152 = rsqrtss(ZEXT416((uint)fVar125),auVar63);
  fVar87 = auVar152._0_4_;
  fVar123 = fVar87 * 1.5 - fVar87 * fVar87 * fVar125 * 0.5 * fVar87;
  fVar174 = fVar106 * fVar55 + fVar146 * fVar88 + fVar160 * fVar54;
  fVar89 = fVar161 * fVar123;
  auVar63 = rcpss(auVar63,auVar63);
  fVar87 = (2.0 - fVar125 * auVar63._0_4_) * auVar63._0_4_;
  local_3e8 = fVar207 * fVar175 * fVar173;
  fStack_3e4 = fVar207 * fVar249 * fVar173;
  fStack_3e0 = fVar207 * fVar247 * fVar173;
  fStack_3dc = fVar207 * fVar124;
  local_3f8 = fVar194 - local_3e8;
  fStack_3f4 = fVar195 - fStack_3e4;
  fStack_3f0 = fVar196 - fStack_3e0;
  fStack_3ec = fVar207 - fStack_3dc;
  fVar175 = fVar207 * fVar91 * (fVar138 * fVar104 - fVar239 * fVar175) * fVar173 +
            fVar217 * fVar175 * fVar173;
  fVar235 = fVar207 * fVar91 * (fVar138 * fVar105 - fVar239 * fVar249) * fVar173 +
            fVar217 * fVar249 * fVar173;
  fVar237 = fVar207 * fVar91 * (fVar138 * fVar90 - fVar239 * fVar247) * fVar173 +
            fVar217 * fVar247 * fVar173;
  fVar239 = fVar207 * fVar91 * (fVar138 * (fVar217 * fVar241 - fVar241 * fVar217) -
                               fVar239 * fVar251) * fVar173 + fVar217 * fVar124;
  local_3e8 = local_3e8 + fVar194;
  fStack_3e4 = fStack_3e4 + fVar195;
  fStack_3e0 = fStack_3e0 + fVar196;
  fStack_3dc = fStack_3dc + fVar207;
  fVar90 = fVar226 * fVar160 * fVar123;
  fVar91 = fVar226 * fVar146 * fVar123;
  fVar104 = fVar226 * fVar106 * fVar123;
  fVar105 = fVar226 * fVar89;
  local_418 = fVar218 - fVar90;
  fStack_414 = fVar223 - fVar91;
  fStack_410 = fVar224 - fVar104;
  fStack_40c = fVar226 - fVar105;
  fVar124 = fVar226 * fVar87 * (fVar125 * fVar54 - fVar174 * fVar160) * fVar123 +
            fVar139 * fVar160 * fVar123;
  fVar54 = fVar226 * fVar87 * (fVar125 * fVar88 - fVar174 * fVar146) * fVar123 +
           fVar139 * fVar146 * fVar123;
  fVar55 = fVar226 * fVar87 * (fVar125 * fVar55 - fVar174 * fVar106) * fVar123 +
           fVar139 * fVar106 * fVar123;
  fVar87 = fVar226 * fVar87 * (fVar125 * (fVar139 * fVar137 - fVar137 * fVar139) - fVar174 * fVar161
                              ) * fVar123 + fVar139 * fVar89;
  fVar90 = fVar90 + fVar218;
  fVar91 = fVar91 + fVar223;
  fVar104 = fVar104 + fVar224;
  fVar105 = fVar105 + fVar226;
  local_408 = (fVar208 - fVar175) * 0.33333334 + local_3f8;
  fStack_404 = (fVar209 - fVar235) * 0.33333334 + fStack_3f4;
  fStack_400 = (fVar216 - fVar237) * 0.33333334 + fStack_3f0;
  fStack_3fc = (fVar217 - fVar239) * 0.33333334 + fStack_3ec;
  local_428 = local_418 - (fVar144 - fVar124) * 0.33333334;
  fStack_424 = fStack_414 - (fVar145 - fVar54) * 0.33333334;
  fStack_420 = fStack_410 - (fVar162 - fVar55) * 0.33333334;
  fStack_41c = fStack_40c - (fVar139 - fVar87) * 0.33333334;
  fVar144 = fVar90 - (fVar124 + fVar144) * 0.33333334;
  fVar145 = fVar91 - (fVar54 + fVar145) * 0.33333334;
  fVar146 = fVar104 - (fVar55 + fVar162) * 0.33333334;
  fVar160 = fVar105 - (fVar87 + fVar139) * 0.33333334;
  local_148 = local_3f8 - local_1b8;
  fStack_144 = fStack_3f4 - fStack_1b4;
  fStack_140 = fStack_3f0 - fStack_1b0;
  fStack_13c = fStack_3ec - 0.0;
  fVar124 = pre->ray_space[k].vx.field_0.m128[0];
  fVar54 = pre->ray_space[k].vx.field_0.m128[1];
  fVar55 = pre->ray_space[k].vy.field_0.m128[0];
  fVar87 = pre->ray_space[k].vy.field_0.m128[1];
  fVar88 = pre->ray_space[k].vz.field_0.m128[0];
  fVar89 = pre->ray_space[k].vz.field_0.m128[1];
  fVar194 = local_148 * fVar124 + fStack_144 * fVar55 + fStack_140 * fVar88;
  fVar195 = local_148 * fVar54 + fStack_144 * fVar87 + fStack_140 * fVar89;
  local_338 = CONCAT44(fVar195,fVar194);
  local_158 = local_408 - local_1b8;
  fStack_154 = fStack_404 - fStack_1b4;
  fStack_150 = fStack_400 - fStack_1b0;
  fStack_14c = fStack_3fc - 0.0;
  fVar196 = local_158 * fVar124 + fStack_154 * fVar55 + fStack_150 * fVar88;
  fVar207 = local_158 * fVar54 + fStack_154 * fVar87 + fStack_150 * fVar89;
  local_348 = CONCAT44(fVar207,fVar196);
  local_168 = local_428 - local_1b8;
  fStack_164 = fStack_424 - fStack_1b4;
  fStack_160 = fStack_420 - fStack_1b0;
  fStack_15c = fStack_41c - 0.0;
  fVar137 = local_168 * fVar124 + fStack_164 * fVar55 + fStack_160 * fVar88;
  fVar138 = local_168 * fVar54 + fStack_164 * fVar87 + fStack_160 * fVar89;
  local_358 = CONCAT44(fVar138,fVar137);
  local_178 = local_418 - local_1b8;
  fStack_174 = fStack_414 - fStack_1b4;
  fStack_170 = fStack_410 - fStack_1b0;
  fStack_16c = fStack_40c - 0.0;
  fVar161 = local_178 * fVar124 + fStack_174 * fVar55 + fStack_170 * fVar88;
  fVar125 = local_178 * fVar54 + fStack_174 * fVar87 + fStack_170 * fVar89;
  local_368 = CONCAT44(fVar125,fVar161);
  local_188 = local_3e8 - local_1b8;
  fStack_184 = fStack_3e4 - fStack_1b4;
  fStack_180 = fStack_3e0 - fStack_1b0;
  fStack_17c = fStack_3dc - 0.0;
  fVar173 = local_188 * fVar124 + fStack_184 * fVar55 + fStack_180 * fVar88;
  fVar174 = local_188 * fVar54 + fStack_184 * fVar87 + fStack_180 * fVar89;
  local_278 = (fVar175 + fVar208) * 0.33333334 + local_3e8;
  fStack_274 = (fVar235 + fVar209) * 0.33333334 + fStack_3e4;
  fStack_270 = (fVar237 + fVar216) * 0.33333334 + fStack_3e0;
  fStack_26c = (fVar239 + fVar217) * 0.33333334 + fStack_3dc;
  local_198 = local_278 - local_1b8;
  fStack_194 = fStack_274 - fStack_1b4;
  fStack_190 = fStack_270 - fStack_1b0;
  fStack_18c = fStack_26c - 0.0;
  fVar139 = local_198 * fVar124 + fStack_194 * fVar55 + fStack_190 * fVar88;
  fVar162 = local_198 * fVar54 + fStack_194 * fVar87 + fStack_190 * fVar89;
  local_388 = CONCAT44(fVar162,fVar139);
  local_1a8 = fVar144 - local_1b8;
  fStack_1a4 = fVar145 - fStack_1b4;
  fStack_1a0 = fVar146 - fStack_1b0;
  fStack_19c = fVar160 - 0.0;
  fVar106 = local_1a8 * fVar124 + fStack_1a4 * fVar55 + fStack_1a0 * fVar88;
  fVar123 = local_1a8 * fVar54 + fStack_1a4 * fVar87 + fStack_1a0 * fVar89;
  local_1b8 = fVar90 - local_1b8;
  fStack_1b4 = fVar91 - fStack_1b4;
  fStack_1b0 = fVar104 - fStack_1b0;
  fStack_1ac = fVar105 - 0.0;
  fVar55 = local_1b8 * fVar124 + fStack_1b4 * fVar55 + fStack_1b0 * fVar88;
  fVar54 = local_1b8 * fVar54 + fStack_1b4 * fVar87 + fStack_1b0 * fVar89;
  local_3a8 = CONCAT44(fVar54,fVar55);
  auVar254._8_8_ = local_388;
  auVar254._0_8_ = local_348;
  auVar190._8_8_ = local_3a8;
  auVar190._0_8_ = local_368;
  auVar78._8_4_ = fVar173;
  auVar78._0_8_ = local_338;
  auVar78._12_4_ = fVar174;
  auVar63 = minps(auVar78,auVar254);
  auVar97._8_4_ = fVar106;
  auVar97._0_8_ = local_358;
  auVar97._12_4_ = fVar123;
  auVar152 = minps(auVar97,auVar190);
  auVar63 = minps(auVar63,auVar152);
  auVar98._4_4_ = fVar195;
  auVar98._0_4_ = fVar194;
  auVar98._8_4_ = fVar173;
  auVar98._12_4_ = fVar174;
  auVar152 = maxps(auVar98,auVar254);
  auVar109._4_4_ = fVar138;
  auVar109._0_4_ = fVar137;
  auVar109._8_4_ = fVar106;
  auVar109._12_4_ = fVar123;
  auVar110 = maxps(auVar109,auVar190);
  auVar153 = maxps(auVar152,auVar110);
  auVar12._4_8_ = auVar110._8_8_;
  auVar12._0_4_ = auVar63._4_4_;
  auVar111._0_8_ = auVar12._0_8_ << 0x20;
  auVar111._8_4_ = auVar63._8_4_;
  auVar111._12_4_ = auVar63._12_4_;
  auVar112._8_8_ = auVar63._8_8_;
  auVar112._0_8_ = auVar111._8_8_;
  auVar152 = minps(auVar63,auVar112);
  auVar13._4_8_ = auVar63._8_8_;
  auVar13._0_4_ = auVar153._4_4_;
  auVar113._0_8_ = auVar13._0_8_ << 0x20;
  auVar113._8_4_ = auVar153._8_4_;
  auVar113._12_4_ = auVar153._12_4_;
  auVar114._8_8_ = auVar153._8_8_;
  auVar114._0_8_ = auVar113._8_8_;
  auVar63 = maxps(auVar153,auVar114);
  auVar79._0_8_ = auVar152._0_8_ & 0x7fffffff7fffffff;
  auVar79._8_4_ = auVar152._8_4_ & 0x7fffffff;
  auVar79._12_4_ = auVar152._12_4_ & 0x7fffffff;
  auVar99._0_8_ = auVar63._0_8_ & 0x7fffffff7fffffff;
  auVar99._8_4_ = auVar63._8_4_ & 0x7fffffff;
  auVar99._12_4_ = auVar63._12_4_ & 0x7fffffff;
  auVar63 = maxps(auVar79,auVar99);
  fVar124 = auVar63._4_4_;
  if (auVar63._4_4_ <= auVar63._0_4_) {
    fVar124 = auVar63._0_4_;
  }
  fVar124 = fVar124 * 9.536743e-07;
  local_248 = fVar124;
  fStack_244 = fVar124;
  fStack_240 = fVar124;
  fStack_23c = fVar124;
  local_258 = -fVar124;
  fStack_254 = -fVar124;
  fStack_250 = -fVar124;
  fStack_24c = -fVar124;
  local_118 = fVar196 - fVar194;
  fStack_114 = fVar207 - fVar195;
  fStack_110 = fVar139 - fVar173;
  fStack_10c = fVar162 - fVar174;
  local_128 = fVar137 - fVar196;
  fStack_124 = fVar138 - fVar207;
  fStack_120 = fVar106 - fVar139;
  fStack_11c = fVar123 - fVar162;
  local_138 = fVar161 - fVar137;
  fStack_134 = fVar125 - fVar138;
  fStack_130 = fVar55 - fVar106;
  fStack_12c = fVar54 - fVar123;
  local_298 = local_3e8 - local_3f8;
  fStack_294 = fStack_3e4 - fStack_3f4;
  fStack_290 = fStack_3e0 - fStack_3f0;
  fStack_28c = fStack_3dc - fStack_3ec;
  local_2a8 = local_278 - local_408;
  fStack_2a4 = fStack_274 - fStack_404;
  fStack_2a0 = fStack_270 - fStack_400;
  fStack_29c = fStack_26c - fStack_3fc;
  local_2b8 = fVar144 - local_428;
  fStack_2b4 = fVar145 - fStack_424;
  fStack_2b0 = fVar146 - fStack_420;
  fStack_2ac = fVar160 - fStack_41c;
  local_2c8 = fVar90 - local_418;
  fStack_2c4 = fVar91 - fStack_414;
  fStack_2c0 = fVar104 - fStack_410;
  fStack_2bc = fVar105 - fStack_40c;
  local_2d8 = uVar48;
  uStack_2d4 = uVar48;
  uStack_2d0 = uVar48;
  uStack_2cc = uVar48;
  uStack_2e4 = local_2e8;
  uStack_2e0 = local_2e8;
  uStack_2dc = local_2e8;
  local_54c = 0;
  uVar46 = 0;
  fVar87 = *(float *)(ray + k * 4 + 0x30);
  local_538 = 0x3f80000000000000;
  local_528 = 0x3f80000000000000;
  uStack_3a0 = local_3a8;
  uStack_380 = local_388;
  uStack_360 = local_368;
  uStack_350 = local_358;
  uStack_340 = local_348;
  uStack_330 = local_338;
  local_378 = fVar173;
  fStack_374 = fVar174;
  fStack_370 = fVar173;
  fStack_36c = fVar174;
  local_398 = fVar106;
  fStack_394 = fVar123;
  fStack_390 = fVar106;
  fStack_38c = fVar123;
  do {
    fVar88 = 1.0 - (float)local_538;
    fVar89 = 1.0 - (float)local_538;
    fVar105 = 1.0 - local_538._4_4_;
    fVar144 = 1.0 - local_538._4_4_;
    fVar145 = (float)local_338 * fVar88 + local_378 * (float)local_538;
    fVar223 = local_338._4_4_ * fVar89 + fStack_374 * (float)local_538;
    fVar226 = (float)uStack_330 * fVar105 + fStack_370 * local_538._4_4_;
    fVar239 = uStack_330._4_4_ * fVar144 + fStack_36c * local_538._4_4_;
    fVar216 = (float)local_348 * fVar88 + (float)local_388 * (float)local_538;
    fVar235 = local_348._4_4_ * fVar89 + local_388._4_4_ * (float)local_538;
    fVar269 = (float)uStack_340 * fVar105 + (float)uStack_380 * local_538._4_4_;
    fVar271 = uStack_340._4_4_ * fVar144 + uStack_380._4_4_ * local_538._4_4_;
    fVar249 = (float)local_358 * fVar88 + local_398 * (float)local_538;
    fVar251 = local_358._4_4_ * fVar89 + fStack_394 * (float)local_538;
    fVar238 = (float)uStack_350 * fVar105 + fStack_390 * local_538._4_4_;
    fVar240 = uStack_350._4_4_ * fVar144 + fStack_38c * local_538._4_4_;
    fVar261 = fVar88 * (float)local_368 + (float)local_538 * (float)local_3a8;
    fVar268 = fVar89 * local_368._4_4_ + (float)local_538 * local_3a8._4_4_;
    fVar270 = fVar105 * (float)uStack_360 + local_538._4_4_ * (float)uStack_3a0;
    fVar272 = fVar144 * uStack_360._4_4_ + local_538._4_4_ * uStack_3a0._4_4_;
    fVar88 = (local_528._4_4_ - (float)local_528) * 0.11111111;
    fVar242 = (local_528._4_4_ - (float)local_528) * 0.0 + (float)local_528;
    fVar248 = (local_528._4_4_ - (float)local_528) * 0.33333334 + (float)local_528;
    fVar250 = (local_528._4_4_ - (float)local_528) * 0.6666667 + (float)local_528;
    fVar252 = (local_528._4_4_ - (float)local_528) * 1.0 + (float)local_528;
    fVar253 = 1.0 - fVar242;
    fVar258 = 1.0 - fVar248;
    fVar259 = 1.0 - fVar250;
    fVar260 = 1.0 - fVar252;
    fVar160 = fVar216 * fVar253 + fVar249 * fVar242;
    fVar175 = fVar216 * fVar258 + fVar249 * fVar248;
    fVar208 = fVar216 * fVar259 + fVar249 * fVar250;
    fVar209 = fVar216 * fVar260 + fVar249 * fVar252;
    fVar224 = fVar235 * fVar253 + fVar251 * fVar242;
    fVar237 = fVar235 * fVar258 + fVar251 * fVar248;
    fVar241 = fVar235 * fVar259 + fVar251 * fVar250;
    fVar247 = fVar235 * fVar260 + fVar251 * fVar252;
    fVar89 = (fVar145 * fVar253 + fVar216 * fVar242) * fVar253 + fVar242 * fVar160;
    fVar105 = (fVar145 * fVar258 + fVar216 * fVar248) * fVar258 + fVar248 * fVar175;
    fVar144 = (fVar145 * fVar259 + fVar216 * fVar250) * fVar259 + fVar250 * fVar208;
    fVar145 = (fVar145 * fVar260 + fVar216 * fVar252) * fVar260 + fVar252 * fVar209;
    fVar216 = (fVar223 * fVar253 + fVar235 * fVar242) * fVar253 + fVar242 * fVar224;
    fVar217 = (fVar223 * fVar258 + fVar235 * fVar248) * fVar258 + fVar248 * fVar237;
    fVar218 = (fVar223 * fVar259 + fVar235 * fVar250) * fVar259 + fVar250 * fVar241;
    fVar223 = (fVar223 * fVar260 + fVar235 * fVar252) * fVar260 + fVar252 * fVar247;
    fVar160 = fVar160 * fVar253 + (fVar249 * fVar253 + fVar261 * fVar242) * fVar242;
    fVar175 = fVar175 * fVar258 + (fVar249 * fVar258 + fVar261 * fVar248) * fVar248;
    fVar208 = fVar208 * fVar259 + (fVar249 * fVar259 + fVar261 * fVar250) * fVar250;
    fVar209 = fVar209 * fVar260 + (fVar249 * fVar260 + fVar261 * fVar252) * fVar252;
    fVar235 = fVar224 * fVar253 + (fVar251 * fVar253 + fVar268 * fVar242) * fVar242;
    fVar224 = fVar237 * fVar258 + (fVar251 * fVar258 + fVar268 * fVar248) * fVar248;
    fVar237 = fVar241 * fVar259 + (fVar251 * fVar259 + fVar268 * fVar250) * fVar250;
    fVar241 = fVar247 * fVar260 + (fVar251 * fVar260 + fVar268 * fVar252) * fVar252;
    local_3d8 = fVar253 * fVar89 + fVar242 * fVar160;
    fStack_3d4 = fVar258 * fVar105 + fVar248 * fVar175;
    fStack_3d0 = fVar259 * fVar144 + fVar250 * fVar208;
    fStack_3cc = fVar260 * fVar145 + fVar252 * fVar209;
    local_3c8 = fVar253 * fVar216 + fVar242 * fVar235;
    fStack_3c4 = fVar258 * fVar217 + fVar248 * fVar224;
    fStack_3c0 = fVar259 * fVar218 + fVar250 * fVar237;
    fStack_3bc = fVar260 * fVar223 + fVar252 * fVar241;
    fVar175 = (fVar175 - fVar105) * 3.0 * fVar88;
    fVar144 = (fVar208 - fVar144) * 3.0 * fVar88;
    fVar145 = (fVar209 - fVar145) * 3.0 * fVar88;
    fVar209 = (fVar224 - fVar217) * 3.0 * fVar88;
    fVar237 = (fVar237 - fVar218) * 3.0 * fVar88;
    fVar223 = (fVar241 - fVar223) * 3.0 * fVar88;
    local_1e8._4_4_ = fStack_3d0;
    local_1e8._0_4_ = fStack_3d4;
    local_1c8._4_4_ = fStack_3c0;
    local_1c8._0_4_ = fStack_3c4;
    fVar208 = local_3d8 + (fVar160 - fVar89) * 3.0 * fVar88;
    fVar217 = fStack_3d4 + fVar175;
    fVar218 = fStack_3d0 + fVar144;
    fVar224 = fStack_3cc + fVar145;
    fVar89 = local_3c8 + (fVar235 - fVar216) * 3.0 * fVar88;
    fVar105 = fStack_3c4 + fVar209;
    fStack_540 = fStack_3c0 + fVar237;
    fStack_53c = fStack_3bc + fVar223;
    local_3b8._0_4_ = fStack_3d4 - fVar175;
    local_3b8._4_4_ = fStack_3d0 - fVar144;
    local_3b8._8_4_ = fStack_3cc - fVar145;
    local_3b8._12_4_ = 0;
    local_1c8._8_4_ = fStack_3bc;
    local_1c8._12_4_ = 0;
    local_1d8._0_4_ = fStack_3c4 - fVar209;
    local_1d8._4_4_ = fStack_3c0 - fVar237;
    local_1d8._8_4_ = fStack_3bc - fVar223;
    local_1d8._12_4_ = 0;
    fVar144 = fVar269 * fVar253 + fVar238 * fVar242;
    fVar145 = fVar269 * fVar258 + fVar238 * fVar248;
    fVar160 = fVar269 * fVar259 + fVar238 * fVar250;
    fVar175 = fVar269 * fVar260 + fVar238 * fVar252;
    fVar209 = fVar271 * fVar253 + fVar240 * fVar242;
    fVar216 = fVar271 * fVar258 + fVar240 * fVar248;
    fVar223 = fVar271 * fVar259 + fVar240 * fVar250;
    fVar268 = fVar271 * fVar260 + fVar240 * fVar252;
    fVar247 = (fVar226 * fVar253 + fVar269 * fVar242) * fVar253 + fVar242 * fVar144;
    fVar249 = (fVar226 * fVar258 + fVar269 * fVar248) * fVar258 + fVar248 * fVar145;
    fVar251 = (fVar226 * fVar259 + fVar269 * fVar250) * fVar259 + fVar250 * fVar160;
    fVar269 = (fVar226 * fVar260 + fVar269 * fVar252) * fVar260 + fVar252 * fVar175;
    fVar241 = (fVar239 * fVar253 + fVar271 * fVar242) * fVar253 + fVar242 * fVar209;
    fVar235 = (fVar239 * fVar258 + fVar271 * fVar248) * fVar258 + fVar248 * fVar216;
    fVar237 = (fVar239 * fVar259 + fVar271 * fVar250) * fVar259 + fVar250 * fVar223;
    fVar239 = (fVar239 * fVar260 + fVar271 * fVar252) * fVar260 + fVar252 * fVar268;
    fVar144 = fVar144 * fVar253 + (fVar238 * fVar253 + fVar270 * fVar242) * fVar242;
    fVar145 = fVar145 * fVar258 + (fVar238 * fVar258 + fVar270 * fVar248) * fVar248;
    fVar160 = fVar160 * fVar259 + (fVar238 * fVar259 + fVar270 * fVar250) * fVar250;
    fVar175 = fVar175 * fVar260 + (fVar238 * fVar260 + fVar270 * fVar252) * fVar252;
    fVar271 = fVar209 * fVar253 + (fVar240 * fVar253 + fVar272 * fVar242) * fVar242;
    fVar238 = fVar216 * fVar258 + (fVar240 * fVar258 + fVar272 * fVar248) * fVar248;
    fVar261 = fVar223 * fVar259 + (fVar240 * fVar259 + fVar272 * fVar250) * fVar250;
    fVar268 = fVar268 * fVar260 + (fVar240 * fVar260 + fVar272 * fVar252) * fVar252;
    fVar209 = fVar253 * fVar247 + fVar242 * fVar144;
    fVar216 = fVar258 * fVar249 + fVar248 * fVar145;
    fVar223 = fVar259 * fVar251 + fVar250 * fVar160;
    fVar226 = fVar260 * fVar269 + fVar252 * fVar175;
    fVar240 = fVar253 * fVar241 + fVar242 * fVar271;
    fVar242 = fVar258 * fVar235 + fVar248 * fVar238;
    fVar248 = fVar259 * fVar237 + fVar250 * fVar261;
    fVar250 = fVar260 * fVar239 + fVar252 * fVar268;
    fVar145 = (fVar145 - fVar249) * 3.0 * fVar88;
    fVar160 = (fVar160 - fVar251) * 3.0 * fVar88;
    fVar175 = (fVar175 - fVar269) * 3.0 * fVar88;
    fVar249 = (fVar238 - fVar235) * 3.0 * fVar88;
    fVar251 = (fVar261 - fVar237) * 3.0 * fVar88;
    fVar269 = (fVar268 - fVar239) * 3.0 * fVar88;
    local_1f8._4_4_ = fVar223;
    local_1f8._0_4_ = fVar216;
    local_1f8._8_4_ = fVar226;
    local_1f8._12_4_ = 0;
    local_218._4_4_ = fVar248;
    local_218._0_4_ = fVar242;
    local_218._8_4_ = fVar250;
    local_218._12_4_ = 0;
    fVar144 = fVar209 + (fVar144 - fVar247) * 3.0 * fVar88;
    fVar235 = fVar216 + fVar145;
    fVar237 = fVar223 + fVar160;
    fVar239 = fVar226 + fVar175;
    local_208 = fVar240 + (fVar271 - fVar241) * 3.0 * fVar88;
    fStack_204 = fVar242 + fVar249;
    fStack_200 = fVar248 + fVar251;
    fStack_1fc = fVar250 + fVar269;
    local_238._0_4_ = fVar216 - fVar145;
    local_238._4_4_ = fVar223 - fVar160;
    local_238._8_4_ = fVar226 - fVar175;
    local_238._12_4_ = 0;
    local_228._0_4_ = fVar242 - fVar249;
    local_228._4_4_ = fVar248 - fVar251;
    local_228._8_4_ = fVar250 - fVar269;
    local_228._12_4_ = 0;
    local_1e8._8_4_ = fStack_3cc;
    local_1e8._12_4_ = 0;
    fVar241 = (fVar216 - fStack_3d4) + (fVar209 - local_3d8);
    fVar247 = (fVar223 - fStack_3d0) + (fVar216 - fStack_3d4);
    fVar249 = (fVar226 - fStack_3cc) + (fVar223 - fStack_3d0);
    fVar251 = (fVar226 - fStack_3cc) + 0.0;
    fVar88 = (fVar242 - fStack_3c4) + (fVar240 - local_3c8);
    fVar145 = (fVar248 - fStack_3c0) + (fVar242 - fStack_3c4);
    fVar160 = (fVar250 - fStack_3bc) + (fVar248 - fStack_3c0);
    fVar175 = (fVar250 - fStack_3bc) + 0.0;
    auVar154._0_8_ =
         CONCAT44(fStack_3c4 * fVar247 - fStack_3d4 * fVar145,
                  local_3c8 * fVar241 - local_3d8 * fVar88);
    auVar154._8_4_ = fStack_3c0 * fVar249 - fStack_3d0 * fVar160;
    auVar154._12_4_ = fStack_3bc * fVar251 - fStack_3cc * fVar175;
    auVar115._0_4_ = fVar89 * fVar241 - fVar208 * fVar88;
    auVar115._4_4_ = fVar105 * fVar247 - fVar217 * fVar145;
    auVar115._8_4_ = fStack_540 * fVar249 - fVar218 * fVar160;
    auVar115._12_4_ = fStack_53c * fVar251 - fVar224 * fVar175;
    auVar127._0_8_ =
         CONCAT44(local_1d8._4_4_ * fVar247 - fVar145 * local_3b8._4_4_,
                  local_1d8._0_4_ * fVar241 - fVar88 * local_3b8._0_4_);
    auVar127._8_4_ = local_1d8._8_4_ * fVar249 - fVar160 * local_3b8._8_4_;
    auVar127._12_4_ = fVar251 * 0.0 - fVar175 * 0.0;
    auVar273._0_4_ = fVar241 * fStack_3c4 - fVar88 * fStack_3d4;
    auVar273._4_4_ = fVar247 * fStack_3c0 - fVar145 * fStack_3d0;
    auVar273._8_4_ = fVar249 * fStack_3bc - fVar160 * fStack_3cc;
    auVar273._12_4_ = fVar251 * 0.0 - fVar175 * 0.0;
    auVar80._0_8_ =
         CONCAT44(fVar242 * fVar247 - fVar216 * fVar145,fVar240 * fVar241 - fVar209 * fVar88);
    auVar80._8_4_ = fVar248 * fVar249 - fVar223 * fVar160;
    auVar80._12_4_ = fVar250 * fVar251 - fVar226 * fVar175;
    auVar232._0_4_ = local_208 * fVar241 - fVar144 * fVar88;
    auVar232._4_4_ = fStack_204 * fVar247 - fVar235 * fVar145;
    auVar232._8_4_ = fStack_200 * fVar249 - fVar237 * fVar160;
    auVar232._12_4_ = fStack_1fc * fVar251 - fVar239 * fVar175;
    auVar198._0_8_ =
         CONCAT44(local_228._4_4_ * fVar247 - fVar145 * local_238._4_4_,
                  local_228._0_4_ * fVar241 - fVar88 * local_238._0_4_);
    auVar198._8_4_ = local_228._8_4_ * fVar249 - fVar160 * local_238._8_4_;
    auVar198._12_4_ = fVar251 * 0.0 - fVar175 * 0.0;
    auVar219._0_4_ = fVar241 * fVar242 - fVar88 * fVar216;
    auVar219._4_4_ = fVar247 * fVar248 - fVar145 * fVar223;
    auVar219._8_4_ = fVar249 * fVar250 - fVar160 * fVar226;
    auVar219._12_4_ = fVar251 * 0.0 - fVar175 * 0.0;
    auVar263._8_4_ = auVar154._8_4_;
    auVar263._0_8_ = auVar154._0_8_;
    auVar263._12_4_ = auVar154._12_4_;
    auVar153 = minps(auVar263,auVar115);
    auVar152 = maxps(auVar154,auVar115);
    auVar116._8_4_ = auVar127._8_4_;
    auVar116._0_8_ = auVar127._0_8_;
    auVar116._12_4_ = auVar127._12_4_;
    auVar63 = minps(auVar116,auVar273);
    auVar264 = minps(auVar153,auVar63);
    auVar63 = maxps(auVar127,auVar273);
    auVar110 = maxps(auVar152,auVar63);
    auVar117._8_4_ = auVar80._8_4_;
    auVar117._0_8_ = auVar80._0_8_;
    auVar117._12_4_ = auVar80._12_4_;
    auVar152 = minps(auVar117,auVar232);
    auVar63 = maxps(auVar80,auVar232);
    auVar128._8_4_ = auVar198._8_4_;
    auVar128._0_8_ = auVar198._0_8_;
    auVar128._12_4_ = auVar198._12_4_;
    auVar153 = minps(auVar128,auVar219);
    auVar152 = minps(auVar152,auVar153);
    auVar153 = minps(auVar264,auVar152);
    auVar152 = maxps(auVar198,auVar219);
    auVar63 = maxps(auVar63,auVar152);
    auVar63 = maxps(auVar110,auVar63);
    auVar155._0_4_ =
         -(uint)(local_258 <= auVar63._0_4_ && auVar153._0_4_ <= local_248) & local_268._0_4_;
    auVar155._4_4_ =
         -(uint)(fStack_254 <= auVar63._4_4_ && auVar153._4_4_ <= fStack_244) & local_268._4_4_;
    auVar155._8_4_ =
         -(uint)(fStack_250 <= auVar63._8_4_ && auVar153._8_4_ <= fStack_240) & local_268._8_4_;
    auVar155._12_4_ =
         -(uint)(fStack_24c <= auVar63._12_4_ && auVar153._12_4_ <= fStack_23c) & local_268._12_4_;
    iVar43 = movmskps((int)uVar45,auVar155);
    uVar49 = 0;
    if (iVar43 != 0) {
      fVar241 = (fVar216 - fVar209) + (fStack_3d4 - local_3d8);
      fVar247 = (fVar223 - fVar216) + (fStack_3d0 - fStack_3d4);
      fVar249 = (fVar226 - fVar223) + (fStack_3cc - fStack_3d0);
      fVar251 = (0.0 - fVar226) + (0.0 - fStack_3cc);
      fVar88 = (fVar242 - fVar240) + (fStack_3c4 - local_3c8);
      fVar145 = (fVar248 - fVar242) + (fStack_3c0 - fStack_3c4);
      fVar160 = (fVar250 - fVar248) + (fStack_3bc - fStack_3c0);
      fVar175 = (0.0 - fVar250) + (0.0 - fStack_3bc);
      auVar274._0_8_ =
           CONCAT44(fStack_3c4 * fVar247 - fStack_3d4 * fVar145,
                    local_3c8 * fVar241 - local_3d8 * fVar88);
      auVar274._8_4_ = fStack_3c0 * fVar249 - fStack_3d0 * fVar160;
      auVar274._12_4_ = fStack_3bc * fVar251 - fStack_3cc * fVar175;
      auVar118._0_4_ = fVar89 * fVar241 - fVar208 * fVar88;
      auVar118._4_4_ = fVar105 * fVar247 - fVar217 * fVar145;
      auVar118._8_4_ = fStack_540 * fVar249 - fVar218 * fVar160;
      auVar118._12_4_ = fStack_53c * fVar251 - fVar224 * fVar175;
      auVar191._0_8_ =
           CONCAT44(local_1d8._4_4_ * fVar247 - local_3b8._4_4_ * fVar145,
                    local_1d8._0_4_ * fVar241 - local_3b8._0_4_ * fVar88);
      auVar191._8_4_ = local_1d8._8_4_ * fVar249 - local_3b8._8_4_ * fVar160;
      auVar191._12_4_ = fVar251 * 0.0 - fVar175 * 0.0;
      auVar129._0_4_ = fStack_3c4 * fVar241 - fStack_3d4 * fVar88;
      auVar129._4_4_ = fStack_3c0 * fVar247 - fStack_3d0 * fVar145;
      auVar129._8_4_ = fStack_3bc * fVar249 - fStack_3cc * fVar160;
      auVar129._12_4_ = fVar251 * 0.0 - fVar175 * 0.0;
      auVar255._0_8_ =
           CONCAT44(fVar242 * fVar247 - fVar216 * fVar145,fVar240 * fVar241 - fVar209 * fVar88);
      auVar255._8_4_ = fVar248 * fVar249 - fVar223 * fVar160;
      auVar255._12_4_ = fVar250 * fVar251 - fVar226 * fVar175;
      auVar142._0_4_ = local_208 * fVar241 - fVar144 * fVar88;
      auVar142._4_4_ = fStack_204 * fVar247 - fVar235 * fVar145;
      auVar142._8_4_ = fStack_200 * fVar249 - fVar237 * fVar160;
      auVar142._12_4_ = fStack_1fc * fVar251 - fVar239 * fVar175;
      auVar233._0_8_ =
           CONCAT44(local_228._4_4_ * fVar247 - local_238._4_4_ * fVar145,
                    local_228._0_4_ * fVar241 - local_238._0_4_ * fVar88);
      auVar233._8_4_ = local_228._8_4_ * fVar249 - local_238._8_4_ * fVar160;
      auVar233._12_4_ = fVar251 * 0.0 - fVar175 * 0.0;
      auVar220._0_4_ = fVar241 * fVar242 - fVar88 * fVar216;
      auVar220._4_4_ = fVar247 * fVar248 - fVar145 * fVar223;
      auVar220._8_4_ = fVar249 * fVar250 - fVar160 * fVar226;
      auVar220._12_4_ = fVar251 * 0.0 - fVar175 * 0.0;
      auVar81._8_4_ = auVar274._8_4_;
      auVar81._0_8_ = auVar274._0_8_;
      auVar81._12_4_ = auVar274._12_4_;
      auVar63 = minps(auVar81,auVar118);
      auVar153 = maxps(auVar274,auVar118);
      auVar119._8_4_ = auVar191._8_4_;
      auVar119._0_8_ = auVar191._0_8_;
      auVar119._12_4_ = auVar191._12_4_;
      auVar152 = minps(auVar119,auVar129);
      auVar63 = minps(auVar63,auVar152);
      auVar152 = maxps(auVar191,auVar129);
      auVar264 = maxps(auVar153,auVar152);
      auVar120._8_4_ = auVar255._8_4_;
      auVar120._0_8_ = auVar255._0_8_;
      auVar120._12_4_ = auVar255._12_4_;
      auVar152 = minps(auVar120,auVar142);
      auVar110 = maxps(auVar255,auVar142);
      auVar130._8_4_ = auVar233._8_4_;
      auVar130._0_8_ = auVar233._0_8_;
      auVar130._12_4_ = auVar233._12_4_;
      auVar153 = minps(auVar130,auVar220);
      auVar152 = minps(auVar152,auVar153);
      auVar63 = minps(auVar63,auVar152);
      auVar152 = maxps(auVar233,auVar220);
      auVar152 = maxps(auVar110,auVar152);
      auVar152 = maxps(auVar264,auVar152);
      auVar275._0_4_ =
           -(uint)(local_258 <= auVar152._0_4_ && auVar63._0_4_ <= local_248) & auVar155._0_4_;
      auVar275._4_4_ =
           -(uint)(fStack_254 <= auVar152._4_4_ && auVar63._4_4_ <= fStack_244) & auVar155._4_4_;
      auVar275._8_4_ =
           -(uint)(fStack_250 <= auVar152._8_4_ && auVar63._8_4_ <= fStack_240) & auVar155._8_4_;
      auVar275._12_4_ =
           -(uint)(fStack_24c <= auVar152._12_4_ && auVar63._12_4_ <= fStack_23c) & auVar155._12_4_;
      uVar49 = movmskps(0,auVar275);
    }
    if (uVar49 != 0) {
      auStack_328[uVar46] = uVar49;
      *(undefined8 *)(afStack_108 + uVar46 * 2) = local_528;
      auStack_58[uVar46] = local_538;
      uVar46 = (ulong)((int)uVar46 + 1);
    }
    do {
      if ((int)uVar46 == 0) {
        if (local_54c != 0) {
          return local_54d;
        }
        fVar124 = *(float *)(ray + k * 4 + 0x80);
        auVar103._4_4_ = -(uint)(fStack_284 <= fVar124);
        auVar103._0_4_ = -(uint)(local_288 <= fVar124);
        auVar103._8_4_ = -(uint)(fStack_280 <= fVar124);
        auVar103._12_4_ = -(uint)(fStack_27c <= fVar124);
        uVar48 = movmskps((int)ray,auVar103);
        uVar48 = (uint)local_430 & uVar48;
        local_54d = uVar48 != 0;
        if (!local_54d) {
          return local_54d;
        }
        goto LAB_00b727a4;
      }
      uVar51 = (int)uVar46 - 1;
      uVar39 = (ulong)uVar51;
      uVar49 = auStack_328[uVar39];
      local_538 = auStack_58[uVar39];
      uVar38 = 0;
      if (uVar49 != 0) {
        for (; (uVar49 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
        }
      }
      uVar49 = uVar49 - 1 & uVar49;
      auStack_328[uVar39] = uVar49;
      if (uVar49 == 0) {
        uVar46 = (ulong)uVar51;
      }
      uVar44 = uVar38 + 1;
      uVar45 = uVar44;
      if ((long)uVar44 < 0) {
        uVar45 = (ulong)((uint)uVar44 & 1) | uVar44 >> 1;
      }
      fVar88 = afStack_108[uVar39 * 2];
      fVar89 = afStack_108[uVar39 * 2 + 1];
      fVar105 = fVar88 * (1.0 - (float)uVar38 * 0.33333334) + fVar89 * (float)uVar38 * 0.33333334;
      fVar144 = fVar88 * (1.0 - (float)uVar44 * 0.33333334) + fVar89 * (float)uVar44 * 0.33333334;
      fVar145 = fVar88 * 0.0 + fVar89 * 0.0;
      fVar89 = fVar88 * 0.0 + fVar89 * 0.0;
      fVar88 = fVar144 - fVar105;
      local_528 = CONCAT44(fVar144,fVar105);
      if (0.16666667 <= fVar88) break;
      fVar160 = (float)local_538;
      fVar175 = (float)((ulong)local_538 >> 0x20);
      fVar208 = 1.0 - fVar160;
      fVar209 = 1.0 - fVar160;
      fVar216 = 1.0 - fVar175;
      fVar217 = 1.0 - fVar175;
      fVar235 = (float)local_338 * fVar208 + local_378 * fVar160;
      fVar237 = local_338._4_4_ * fVar209 + fStack_374 * fVar160;
      fVar239 = (float)uStack_330 * fVar216 + fStack_370 * fVar175;
      fVar241 = uStack_330._4_4_ * fVar217 + fStack_36c * fVar175;
      fVar271 = (float)local_348 * fVar208 + (float)local_388 * fVar160;
      fVar238 = local_348._4_4_ * fVar209 + local_388._4_4_ * fVar160;
      fVar261 = (float)uStack_340 * fVar216 + (float)uStack_380 * fVar175;
      fVar268 = uStack_340._4_4_ * fVar217 + uStack_380._4_4_ * fVar175;
      fVar240 = (float)local_358 * fVar208 + local_398 * fVar160;
      fVar248 = local_358._4_4_ * fVar209 + fStack_394 * fVar160;
      fVar252 = (float)uStack_350 * fVar216 + fStack_390 * fVar175;
      fVar258 = uStack_350._4_4_ * fVar217 + fStack_38c * fVar175;
      fVar247 = (fVar208 * (float)local_368 + fVar160 * (float)local_3a8) - fVar240;
      fVar249 = (fVar209 * local_368._4_4_ + fVar160 * local_3a8._4_4_) - fVar248;
      fVar251 = (fVar216 * (float)uStack_360 + fVar175 * (float)uStack_3a0) - fVar252;
      fVar269 = (fVar217 * uStack_360._4_4_ + fVar175 * uStack_3a0._4_4_) - fVar258;
      fVar160 = fVar105 * (fVar240 - fVar271) + fVar271;
      fVar175 = fVar105 * (fVar248 - fVar238) + fVar238;
      fVar208 = fVar105 * (fVar252 - fVar261) + fVar261;
      fVar209 = fVar105 * (fVar258 - fVar268) + fVar268;
      fVar242 = (fVar240 - fVar271) * fVar144 + fVar271;
      fVar250 = (fVar248 - fVar238) * fVar144 + fVar238;
      fVar253 = (fVar252 - fVar261) * fVar144 + fVar261;
      fVar259 = (fVar258 - fVar268) * fVar144 + fVar268;
      fVar216 = fVar105 * (fVar271 - fVar235) + fVar235;
      fVar217 = fVar105 * (fVar238 - fVar237) + fVar237;
      fVar223 = fVar105 * (fVar261 - fVar239) + fVar239;
      fVar226 = fVar105 * (fVar268 - fVar241) + fVar241;
      fVar216 = (fVar160 - fVar216) * fVar105 + fVar216;
      fVar217 = (fVar175 - fVar217) * fVar105 + fVar217;
      fVar223 = (fVar208 - fVar223) * fVar105 + fVar223;
      fVar226 = (fVar209 - fVar226) * fVar105 + fVar226;
      fVar160 = (((fVar105 * fVar247 + fVar240) - fVar160) * fVar105 + fVar160) - fVar216;
      fVar175 = (((fVar105 * fVar249 + fVar248) - fVar175) * fVar105 + fVar175) - fVar217;
      fVar208 = (((fVar105 * fVar251 + fVar252) - fVar208) * fVar105 + fVar208) - fVar223;
      fVar209 = (((fVar105 * fVar269 + fVar258) - fVar209) * fVar105 + fVar209) - fVar226;
      fVar216 = fVar105 * fVar160 + fVar216;
      fVar217 = fVar105 * fVar175 + fVar217;
      fVar223 = fVar105 * fVar208 + fVar223;
      fVar226 = fVar105 * fVar209 + fVar226;
      fVar235 = (fVar271 - fVar235) * fVar144 + fVar235;
      fVar237 = (fVar238 - fVar237) * fVar144 + fVar237;
      fVar239 = (fVar261 - fVar239) * fVar144 + fVar239;
      fVar241 = (fVar268 - fVar241) * fVar144 + fVar241;
      fVar235 = (fVar242 - fVar235) * fVar144 + fVar235;
      fVar237 = (fVar250 - fVar237) * fVar144 + fVar237;
      fVar239 = (fVar253 - fVar239) * fVar144 + fVar239;
      fVar241 = (fVar259 - fVar241) * fVar144 + fVar241;
      fVar271 = (((fVar247 * fVar144 + fVar240) - fVar242) * fVar144 + fVar242) - fVar235;
      fVar238 = (((fVar249 * fVar144 + fVar248) - fVar250) * fVar144 + fVar250) - fVar237;
      fVar261 = (((fVar251 * fVar144 + fVar252) - fVar253) * fVar144 + fVar253) - fVar239;
      fVar268 = (((fVar269 * fVar144 + fVar258) - fVar259) * fVar144 + fVar259) - fVar241;
      fVar235 = fVar144 * fVar271 + fVar235;
      fVar237 = fVar144 * fVar238 + fVar237;
      fVar239 = fVar144 * fVar261 + fVar239;
      fVar241 = fVar144 * fVar268 + fVar241;
      fVar240 = fVar88 * 0.33333334;
      fVar247 = fVar160 * (float)DAT_01ff0f60 * fVar240 + fVar216;
      fVar249 = fVar175 * DAT_01ff0f60._4_4_ * fVar240 + fVar217;
      fVar251 = fVar208 * DAT_01ff0f60._8_4_ * fVar240 + fVar223;
      fVar269 = fVar209 * DAT_01ff0f60._12_4_ * fVar240 + fVar226;
      fVar271 = fVar235 - fVar240 * fVar271 * (float)DAT_01ff0f60;
      fVar238 = fVar237 - fVar240 * fVar238 * DAT_01ff0f60._4_4_;
      fVar261 = fVar239 - fVar240 * fVar261 * DAT_01ff0f60._8_4_;
      fVar268 = fVar241 - fVar240 * fVar268 * DAT_01ff0f60._12_4_;
      local_538 = CONCAT44(fVar241,fVar239);
      fVar250 = (fVar239 - fVar235) + (fVar223 - fVar216);
      fVar252 = (fVar241 - fVar237) + (fVar226 - fVar217);
      auVar199._0_4_ = fVar252 * fVar237;
      auVar199._4_4_ = fVar252 * fVar237;
      auVar199._8_4_ = fVar252 * fVar241;
      auVar199._12_4_ = fVar252 * fVar241;
      fVar160 = fVar216 * fVar250 + fVar217 * fVar252;
      fVar175 = fVar223 * fVar250 + fVar226 * fVar252;
      fVar253 = fVar247 * fVar250 + fVar249 * fVar252;
      fVar258 = fVar251 * fVar250 + fVar269 * fVar252;
      fVar240 = fVar271 * fVar250 + fVar238 * fVar252;
      auVar210._4_4_ = fVar238 * fVar250 + fVar238 * fVar252;
      auVar210._0_4_ = fVar240;
      fVar242 = fVar261 * fVar250 + fVar268 * fVar252;
      fVar208 = fVar250 * fVar235 + auVar199._0_4_;
      fVar248 = fVar250 * fVar239 + auVar199._8_4_;
      auVar14._4_8_ = auVar199._8_8_;
      auVar14._0_4_ = fVar249 * fVar250 + fVar249 * fVar252;
      auVar200._0_8_ = auVar14._0_8_ << 0x20;
      auVar200._8_4_ = fVar258;
      auVar200._12_4_ = fVar269 * fVar250 + fVar269 * fVar252;
      fVar209 = fVar253;
      if (fVar253 <= fVar160) {
        fVar209 = fVar160;
        fVar160 = fVar253;
      }
      auVar201._8_8_ = auVar200._8_8_;
      auVar201._0_8_ = auVar201._8_8_;
      auVar210._8_4_ = fVar242;
      auVar210._12_4_ = fVar268 * fVar250 + fVar268 * fVar252;
      if (fVar208 <= fVar240) {
        auVar210._0_4_ = fVar208;
      }
      if (auVar210._0_4_ <= fVar160) {
        fVar160 = auVar210._0_4_;
      }
      auVar15._4_8_ = auVar210._8_8_;
      auVar15._0_4_ = fVar250 * fVar237 + auVar199._4_4_;
      auVar211._0_8_ = auVar15._0_8_ << 0x20;
      auVar211._8_4_ = fVar248;
      auVar211._12_4_ = fVar250 * fVar241 + auVar199._12_4_;
      if (fVar208 <= fVar240) {
        fVar208 = fVar240;
      }
      auVar212._8_8_ = auVar211._8_8_;
      auVar212._0_8_ = auVar212._8_8_;
      if (fVar208 <= fVar209) {
        fVar208 = fVar209;
      }
      if (fVar258 <= fVar175) {
        auVar201._0_4_ = fVar175;
        fVar175 = fVar258;
      }
      fVar209 = fVar242;
      if (fVar248 <= fVar242) {
        fVar209 = fVar248;
      }
      if (fVar209 <= fVar175) {
        fVar175 = fVar209;
      }
      if (fVar248 <= fVar242) {
        auVar212._0_4_ = fVar242;
      }
      if (auVar212._0_4_ <= auVar201._0_4_) {
        auVar212._0_4_ = auVar201._0_4_;
      }
      uVar45 = CONCAT71((int7)(uVar45 >> 8),fVar88 < 0.001);
      fVar209 = auVar212._0_4_;
      if ((0.0001 <= fVar160) || (fVar209 <= -0.0001)) {
        if ((-0.0001 < fVar208 && fVar175 < 0.0001) ||
           ((fVar160 < 0.0001 && -0.0001 < fVar208 || (fVar175 < 0.0001 && -0.0001 < fVar209))))
        goto LAB_00b73b3a;
        bVar18 = true;
      }
      else {
LAB_00b73b3a:
        fVar248 = (float)(~-(uint)(fVar160 < 0.0) & 0x3f800000 | -(uint)(fVar160 < 0.0) & 0xbf800000
                         );
        fVar242 = (float)(~-(uint)(fVar208 < 0.0) & 0x3f800000 | -(uint)(fVar208 < 0.0) & 0xbf800000
                         );
        fVar240 = 0.0;
        if ((fVar248 == fVar242) && (!NAN(fVar248) && !NAN(fVar242))) {
          fVar240 = INFINITY;
        }
        fVar250 = 0.0;
        if ((fVar248 == fVar242) && (!NAN(fVar248) && !NAN(fVar242))) {
          fVar250 = -INFINITY;
        }
        fVar252 = (float)(~-(uint)(fVar175 < 0.0) & 0x3f800000 | -(uint)(fVar175 < 0.0) & 0xbf800000
                         );
        if ((fVar248 != fVar252) || (fVar253 = fVar250, NAN(fVar248) || NAN(fVar252))) {
          if ((fVar175 != fVar160) || (NAN(fVar175) || NAN(fVar160))) {
            fVar253 = -fVar160 / (fVar175 - fVar160);
            fVar253 = (1.0 - fVar253) * 0.0 + fVar253;
            fVar175 = fVar253;
          }
          else {
            fVar175 = INFINITY;
            if ((fVar160 == 0.0) && (fVar175 = INFINITY, !NAN(fVar160))) {
              fVar175 = 0.0;
            }
            fVar253 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar160 == 0.0) & 1) * 4);
          }
          if (fVar175 <= fVar240) {
            fVar240 = fVar175;
          }
          if (fVar253 <= fVar250) {
            fVar253 = fVar250;
          }
        }
        uVar45 = (ulong)(fVar209 < 0.0);
        fVar160 = *(float *)(&DAT_01ff1ecc + uVar45 * 4);
        if ((fVar242 != fVar160) || (fVar175 = fVar253, NAN(fVar242) || NAN(fVar160))) {
          if ((fVar209 != fVar208) || (NAN(fVar209) || NAN(fVar208))) {
            fVar175 = -fVar208 / (fVar209 - fVar208);
            fVar175 = (1.0 - fVar175) * 0.0 + fVar175;
            fVar209 = fVar175;
          }
          else {
            fVar209 = INFINITY;
            if ((fVar208 == 0.0) && (fVar209 = INFINITY, !NAN(fVar208))) {
              fVar209 = 0.0;
            }
            uVar45 = (ulong)(-(uint)(fVar208 == 0.0) & 1);
            fVar175 = *(float *)(&DAT_01ff1ec4 + uVar45 * 4);
          }
          if (fVar209 <= fVar240) {
            fVar240 = fVar209;
          }
          if (fVar175 <= fVar253) {
            fVar175 = fVar253;
          }
        }
        if ((fVar252 != fVar160) || (NAN(fVar252) || NAN(fVar160))) {
          fVar240 = (float)(~-(uint)(fVar240 < 1.0) & 0x3f800000 |
                           (uint)fVar240 & -(uint)(fVar240 < 1.0));
          fVar175 = (float)(~-(uint)(fVar175 < 1.0) & (uint)fVar175 |
                           -(uint)(fVar175 < 1.0) & 0x3f800000);
        }
        fVar240 = (float)(~-(uint)(fVar240 < 0.0) & (uint)fVar240);
        fVar160 = (float)(~-(uint)(fVar175 < 1.0) & 0x3f800000 |
                         (uint)fVar175 & -(uint)(fVar175 < 1.0));
        bVar18 = true;
        if (fVar240 <= fVar160) {
          fVar240 = fVar240 + -0.1;
          fVar160 = fVar160 + 0.1;
          uVar49 = -(uint)(fVar160 < 1.0);
          fVar240 = (float)(~-(uint)(fVar240 < 0.0) & (uint)fVar240);
          fVar258 = (float)(~uVar49 & 0x3f800000 | (uint)fVar160 & uVar49);
          fVar248 = 1.0 - fVar240;
          fVar250 = 1.0 - fVar240;
          fVar252 = 1.0 - fVar258;
          fVar253 = 1.0 - fVar258;
          fVar160 = fVar216 * fVar248 + fVar223 * fVar240;
          fVar175 = fVar217 * fVar250 + fVar226 * fVar240;
          fVar208 = fVar216 * fVar252 + fVar218 * fVar258;
          fVar209 = fVar217 * fVar253 + fVar224 * fVar258;
          fVar216 = fVar247 * fVar248 + fVar251 * fVar240;
          fVar217 = fVar249 * fVar250 + fVar269 * fVar240;
          fVar247 = fVar247 * fVar252 + fVar251 * fVar258;
          fVar251 = fVar249 * fVar253 + fVar269 * fVar258;
          fVar269 = fVar271 * fVar248 + fVar261 * fVar240;
          fVar242 = fVar238 * fVar250 + fVar268 * fVar240;
          fVar271 = fVar271 * fVar252 + fVar261 * fVar258;
          fVar238 = fVar238 * fVar253 + fVar268 * fVar258;
          fVar261 = fVar248 * fVar235 + fVar239 * fVar240;
          fVar268 = fVar250 * fVar237 + fVar241 * fVar240;
          fVar235 = fVar252 * fVar235 + fStack_540 * fVar258;
          fVar237 = fVar253 * fVar237 + fStack_53c * fVar258;
          fVar262 = fVar239 * (1.0 - fVar240) + fVar241 * fVar240;
          fStack_53c = fVar239 * (1.0 - fVar258) + fVar241 * fVar258;
          fVar249 = 1.0 / fVar88;
          auVar100._0_4_ = fVar235 - fVar261;
          auVar100._4_4_ = fVar237 - fVar268;
          auVar100._8_4_ = fVar235 - fVar235;
          auVar100._12_4_ = fVar237 - fVar237;
          auVar131._0_8_ = CONCAT44(fVar238 - fVar242,fVar271 - fVar269);
          auVar131._8_4_ = fVar271 - fVar271;
          auVar131._12_4_ = fVar238 - fVar238;
          auVar221._0_4_ = fVar247 - fVar216;
          auVar221._4_4_ = fVar251 - fVar217;
          auVar221._8_4_ = fVar247 - fVar247;
          auVar221._12_4_ = fVar251 - fVar251;
          auVar192._0_8_ = CONCAT44((fVar217 - fVar175) * 3.0,(fVar216 - fVar160) * 3.0);
          auVar192._8_4_ = (fVar247 - fVar208) * 3.0;
          auVar192._12_4_ = (fVar251 - fVar209) * 3.0;
          auVar156._0_8_ = CONCAT44((fVar242 - fVar217) * 3.0,(fVar269 - fVar216) * 3.0);
          auVar156._8_4_ = (fVar271 - fVar247) * 3.0;
          auVar156._12_4_ = (fVar238 - fVar251) * 3.0;
          auVar213._0_4_ = (fVar261 - fVar269) * 3.0;
          auVar213._4_4_ = (fVar268 - fVar242) * 3.0;
          auVar213._8_4_ = (fVar235 - fVar271) * 3.0;
          auVar213._12_4_ = (fVar237 - fVar238) * 3.0;
          auVar165._8_4_ = auVar156._8_4_;
          auVar165._0_8_ = auVar156._0_8_;
          auVar165._12_4_ = auVar156._12_4_;
          auVar152 = minps(auVar165,auVar213);
          auVar63 = maxps(auVar156,auVar213);
          auVar202._8_4_ = auVar192._8_4_;
          auVar202._0_8_ = auVar192._0_8_;
          auVar202._12_4_ = auVar192._12_4_;
          auVar110 = minps(auVar202,auVar152);
          auVar153 = maxps(auVar192,auVar63);
          auVar16._4_8_ = auVar63._8_8_;
          auVar16._0_4_ = auVar110._4_4_;
          auVar157._0_8_ = auVar16._0_8_ << 0x20;
          auVar157._8_4_ = auVar110._8_4_;
          auVar157._12_4_ = auVar110._12_4_;
          auVar158._8_8_ = auVar110._8_8_;
          auVar158._0_8_ = auVar157._8_8_;
          auVar17._4_8_ = auVar152._8_8_;
          auVar17._0_4_ = auVar153._4_4_;
          auVar166._0_8_ = auVar17._0_8_ << 0x20;
          auVar166._8_4_ = auVar153._8_4_;
          auVar166._12_4_ = auVar153._12_4_;
          auVar167._8_8_ = auVar153._8_8_;
          auVar167._0_8_ = auVar166._8_8_;
          auVar152 = minps(auVar110,auVar158);
          auVar63 = maxps(auVar153,auVar167);
          fVar252 = auVar152._0_4_ * fVar249;
          fVar253 = auVar152._4_4_ * fVar249;
          fVar258 = auVar152._8_4_ * fVar249;
          fVar259 = auVar152._12_4_ * fVar249;
          fVar251 = fVar249 * auVar63._0_4_;
          fVar269 = fVar249 * auVar63._4_4_;
          fVar238 = fVar249 * auVar63._8_4_;
          fVar249 = fVar249 * auVar63._12_4_;
          fVar248 = 1.0 / (fStack_53c - fVar262);
          auVar121._0_8_ = CONCAT44(fVar209 - fVar175,fVar208 - fVar160);
          auVar121._8_4_ = fVar208 - fVar208;
          auVar121._12_4_ = fVar209 - fVar209;
          auVar168._8_4_ = auVar121._8_4_;
          auVar168._0_8_ = auVar121._0_8_;
          auVar168._12_4_ = auVar121._12_4_;
          auVar153 = minps(auVar168,auVar221);
          auVar152 = maxps(auVar121,auVar221);
          auVar82._8_4_ = auVar131._8_4_;
          auVar82._0_8_ = auVar131._0_8_;
          auVar82._12_4_ = auVar131._12_4_;
          auVar63 = minps(auVar82,auVar100);
          auVar153 = minps(auVar153,auVar63);
          auVar63 = maxps(auVar131,auVar100);
          auVar63 = maxps(auVar152,auVar63);
          fVar240 = auVar153._0_4_ * fVar248;
          fVar242 = auVar153._4_4_ * fVar248;
          fVar250 = fVar248 * auVar63._0_4_;
          fVar248 = fVar248 * auVar63._4_4_;
          local_538 = CONCAT44(fStack_53c,fVar262);
          auVar159._4_4_ = fStack_53c;
          auVar159._0_4_ = fVar144;
          auVar159._8_4_ = fVar145;
          auVar159._12_4_ = fVar89;
          local_b8 = (fVar105 + fVar144) * 0.5;
          fVar160 = (fVar262 + fStack_53c) * 0.5;
          fVar175 = (fVar144 + fVar145) * 0.0;
          fVar208 = (fStack_53c + fVar89) * 0.0;
          fVar209 = local_118 * local_b8 + fVar194;
          fVar216 = fStack_114 * local_b8 + fVar195;
          fVar217 = fStack_110 * local_b8 + fVar173;
          fVar235 = fStack_10c * local_b8 + fVar174;
          fVar237 = local_128 * local_b8 + fVar196;
          fVar239 = fStack_124 * local_b8 + fVar207;
          fVar241 = fStack_120 * local_b8 + fVar139;
          fVar247 = fStack_11c * local_b8 + fVar162;
          fVar209 = (fVar237 - fVar209) * local_b8 + fVar209;
          fVar216 = (fVar239 - fVar216) * local_b8 + fVar216;
          fVar217 = (fVar241 - fVar217) * local_b8 + fVar217;
          fVar235 = (fVar247 - fVar235) * local_b8 + fVar235;
          fVar237 = (((local_138 * local_b8 + fVar137) - fVar237) * local_b8 + fVar237) - fVar209;
          fVar239 = (((fStack_134 * local_b8 + fVar138) - fVar239) * local_b8 + fVar239) - fVar216;
          fVar241 = (((fStack_130 * local_b8 + fVar106) - fVar241) * local_b8 + fVar241) - fVar217;
          fVar247 = (((fStack_12c * local_b8 + fVar123) - fVar247) * local_b8 + fVar247) - fVar235;
          fVar209 = local_b8 * fVar237 + fVar209;
          fVar216 = local_b8 * fVar239 + fVar216;
          fVar237 = fVar237 * 3.0;
          fVar239 = fVar239 * 3.0;
          fVar217 = (local_b8 * fVar241 + fVar217) - fVar209;
          fVar235 = (local_b8 * fVar247 + fVar235) - fVar216;
          fVar237 = (fVar241 * 3.0 - fVar237) * fVar160 + fVar237;
          fVar239 = (fVar247 * 3.0 - fVar239) * fVar160 + fVar239;
          auVar101._0_8_ = CONCAT44(fVar237,fVar217) ^ 0x80000000;
          auVar101._8_4_ = fVar237;
          auVar101._12_4_ = fVar237;
          fVar260 = fVar105 - local_b8;
          fVar270 = fVar262 - fVar160;
          fVar272 = fVar144 - fVar175;
          fVar225 = fStack_53c - fVar208;
          fVar227 = fVar144 - local_b8;
          fVar236 = fStack_53c - fVar160;
          fVar145 = fVar145 - fVar175;
          fVar89 = fVar89 - fVar208;
          fVar209 = fVar217 * fVar160 + fVar209;
          fVar216 = fVar235 * fVar160 + fVar216;
          auVar122._0_8_ = CONCAT44(fVar239,fVar235) ^ 0x8000000000000000;
          auVar122._8_4_ = -fVar239;
          auVar122._12_4_ = -fVar239;
          auVar244._0_4_ = fVar235 * fVar237 - fVar239 * fVar217;
          auVar244._4_4_ = auVar244._0_4_;
          auVar244._8_4_ = auVar244._0_4_;
          auVar244._12_4_ = auVar244._0_4_;
          auVar152 = divps(auVar122,auVar244);
          auVar63 = divps(auVar101,auVar244);
          fVar235 = auVar152._0_4_;
          fVar237 = auVar152._4_4_;
          fVar208 = auVar63._0_4_;
          fVar217 = auVar63._4_4_;
          local_b8 = local_b8 - (fVar216 * fVar208 + fVar209 * fVar235);
          local_a8 = fVar160 - (fVar216 * fVar217 + fVar209 * fVar237);
          fVar175 = fVar160 - (fVar216 * auVar63._8_4_ + fVar209 * auVar152._8_4_);
          fVar160 = fVar160 - (fVar216 * auVar63._12_4_ + fVar209 * auVar152._12_4_);
          auVar265._0_8_ = CONCAT44(fVar237 * fVar240,fVar237 * fVar252);
          auVar265._8_4_ = fVar237 * fVar253;
          auVar265._12_4_ = fVar237 * fVar242;
          auVar214._0_4_ = fVar237 * fVar251;
          auVar214._4_4_ = fVar237 * fVar250;
          auVar214._8_4_ = fVar237 * fVar269;
          auVar214._12_4_ = fVar237 * fVar248;
          auVar276._8_4_ = auVar265._8_4_;
          auVar276._0_8_ = auVar265._0_8_;
          auVar276._12_4_ = auVar265._12_4_;
          auVar110 = minps(auVar276,auVar214);
          auVar152 = maxps(auVar214,auVar265);
          auVar132._0_8_ = CONCAT44(fVar217 * fVar242,fVar217 * fVar253);
          auVar132._8_4_ = fVar217 * fVar258;
          auVar132._12_4_ = fVar217 * fVar259;
          auVar266._0_4_ = fVar217 * fVar269;
          auVar266._4_4_ = fVar217 * fVar248;
          auVar266._8_4_ = fVar217 * fVar238;
          auVar266._12_4_ = fVar217 * fVar249;
          auVar203._8_4_ = auVar132._8_4_;
          auVar203._0_8_ = auVar132._0_8_;
          auVar203._12_4_ = auVar132._12_4_;
          auVar63 = minps(auVar203,auVar266);
          auVar153 = maxps(auVar266,auVar132);
          fVar209 = 0.0 - (auVar153._0_4_ + auVar152._0_4_);
          fVar216 = 1.0 - (auVar153._4_4_ + auVar152._4_4_);
          fVar239 = 0.0 - (auVar153._8_4_ + auVar152._8_4_);
          fVar241 = 0.0 - (auVar153._12_4_ + auVar152._12_4_);
          fVar247 = 0.0 - (auVar63._0_4_ + auVar110._0_4_);
          fVar271 = 1.0 - (auVar63._4_4_ + auVar110._4_4_);
          fVar261 = 0.0 - (auVar63._8_4_ + auVar110._8_4_);
          fVar268 = 0.0 - (auVar63._12_4_ + auVar110._12_4_);
          auVar215._0_8_ = CONCAT44(fVar270 * fVar216,fVar260 * fVar209);
          auVar215._8_4_ = fVar272 * fVar239;
          auVar215._12_4_ = fVar225 * fVar241;
          auVar245._0_8_ = CONCAT44(fVar240 * fVar235,fVar252 * fVar235);
          auVar245._8_4_ = fVar253 * fVar235;
          auVar245._12_4_ = fVar242 * fVar235;
          auVar204._0_4_ = fVar235 * fVar251;
          auVar204._4_4_ = fVar235 * fVar250;
          auVar204._8_4_ = fVar235 * fVar269;
          auVar204._12_4_ = fVar235 * fVar248;
          auVar256._8_4_ = auVar245._8_4_;
          auVar256._0_8_ = auVar245._0_8_;
          auVar256._12_4_ = auVar245._12_4_;
          auVar152 = minps(auVar256,auVar204);
          auVar63 = maxps(auVar204,auVar245);
          auVar169._0_8_ = CONCAT44(fVar242 * fVar208,fVar253 * fVar208);
          auVar169._8_4_ = fVar258 * fVar208;
          auVar169._12_4_ = fVar259 * fVar208;
          auVar267._0_4_ = fVar208 * fVar269;
          auVar267._4_4_ = fVar208 * fVar248;
          auVar267._8_4_ = fVar208 * fVar238;
          auVar267._12_4_ = fVar208 * fVar249;
          auVar277._8_4_ = auVar169._8_4_;
          auVar277._0_8_ = auVar169._0_8_;
          auVar277._12_4_ = auVar169._12_4_;
          auVar110 = minps(auVar277,auVar267);
          auVar246._0_4_ = fVar260 * fVar247;
          auVar246._4_4_ = fVar270 * fVar271;
          auVar246._8_4_ = fVar272 * fVar261;
          auVar246._12_4_ = fVar225 * fVar268;
          auVar133._0_8_ = CONCAT44(fVar216 * fVar236,fVar209 * fVar227);
          auVar133._8_4_ = fVar239 * fVar145;
          auVar133._12_4_ = fVar241 * fVar89;
          auVar143._0_4_ = fVar247 * fVar227;
          auVar143._4_4_ = fVar271 * fVar236;
          auVar143._8_4_ = fVar261 * fVar145;
          auVar143._12_4_ = fVar268 * fVar89;
          auVar153 = maxps(auVar267,auVar169);
          fVar209 = 1.0 - (auVar153._0_4_ + auVar63._0_4_);
          fVar216 = 0.0 - (auVar153._4_4_ + auVar63._4_4_);
          fVar239 = 0.0 - (auVar153._8_4_ + auVar63._8_4_);
          fVar241 = 0.0 - (auVar153._12_4_ + auVar63._12_4_);
          fVar247 = 1.0 - (auVar110._0_4_ + auVar152._0_4_);
          fVar249 = 0.0 - (auVar110._4_4_ + auVar152._4_4_);
          fVar251 = 0.0 - (auVar110._8_4_ + auVar152._8_4_);
          fVar269 = 0.0 - (auVar110._12_4_ + auVar152._12_4_);
          auVar205._0_8_ = CONCAT44(fVar270 * fVar216,fVar260 * fVar209);
          auVar205._8_4_ = fVar272 * fVar239;
          auVar205._12_4_ = fVar225 * fVar241;
          auVar222._0_4_ = fVar260 * fVar247;
          auVar222._4_4_ = fVar270 * fVar249;
          auVar222._8_4_ = fVar272 * fVar251;
          auVar222._12_4_ = fVar225 * fVar269;
          auVar170._0_8_ = CONCAT44(fVar216 * fVar236,fVar209 * fVar227);
          auVar170._8_4_ = fVar239 * fVar145;
          auVar170._12_4_ = fVar241 * fVar89;
          auVar193._0_4_ = fVar247 * fVar227;
          auVar193._4_4_ = fVar249 * fVar236;
          auVar193._8_4_ = fVar251 * fVar145;
          auVar193._12_4_ = fVar269 * fVar89;
          auVar234._8_4_ = auVar205._8_4_;
          auVar234._0_8_ = auVar205._0_8_;
          auVar234._12_4_ = auVar205._12_4_;
          auVar63 = minps(auVar234,auVar222);
          auVar257._8_4_ = auVar170._8_4_;
          auVar257._0_8_ = auVar170._0_8_;
          auVar257._12_4_ = auVar170._12_4_;
          auVar152 = minps(auVar257,auVar193);
          auVar110 = minps(auVar63,auVar152);
          auVar152 = maxps(auVar222,auVar205);
          auVar63 = maxps(auVar193,auVar170);
          auVar153 = maxps(auVar63,auVar152);
          auVar171._8_4_ = auVar215._8_4_;
          auVar171._0_8_ = auVar215._0_8_;
          auVar171._12_4_ = auVar215._12_4_;
          auVar63 = minps(auVar171,auVar246);
          auVar206._8_4_ = auVar133._8_4_;
          auVar206._0_8_ = auVar133._0_8_;
          auVar206._12_4_ = auVar133._12_4_;
          auVar152 = minps(auVar206,auVar143);
          auVar152 = minps(auVar63,auVar152);
          auVar264 = maxps(auVar246,auVar215);
          auVar63 = maxps(auVar143,auVar133);
          auVar63 = maxps(auVar63,auVar264);
          auVar172._0_4_ = auVar110._4_4_ + auVar110._0_4_ + local_b8;
          auVar172._4_4_ = auVar152._4_4_ + auVar152._0_4_ + local_a8;
          auVar172._8_4_ = auVar110._8_4_ + auVar110._4_4_ + fVar175;
          auVar172._12_4_ = auVar110._12_4_ + auVar152._4_4_ + fVar160;
          fVar89 = auVar153._4_4_ + auVar153._0_4_ + local_b8;
          fVar145 = auVar63._4_4_ + auVar63._0_4_ + local_a8;
          auVar134._4_4_ = fVar145;
          auVar134._0_4_ = fVar89;
          auVar21._4_4_ = fVar262;
          auVar21._0_4_ = fVar105;
          auVar21._8_4_ = fVar144;
          auVar21._12_4_ = fStack_53c;
          auVar152 = maxps(auVar21,auVar172);
          auVar134._8_4_ = auVar153._8_4_ + auVar153._4_4_ + fVar175;
          auVar134._12_4_ = auVar153._12_4_ + auVar63._4_4_ + fVar160;
          auVar63 = minps(auVar134,auVar159);
          iVar43 = -(uint)(auVar63._0_4_ < auVar152._0_4_);
          iVar50 = -(uint)(auVar63._4_4_ < auVar152._4_4_);
          auVar136._4_4_ = iVar50;
          auVar136._0_4_ = iVar43;
          auVar136._8_4_ = iVar50;
          auVar136._12_4_ = iVar50;
          auVar135._8_8_ = auVar136._8_8_;
          auVar135._4_4_ = iVar43;
          auVar135._0_4_ = iVar43;
          uVar49 = movmskpd((int)uVar45,auVar135);
          uVar45 = (ulong)uVar49;
          fStack_540 = fVar144;
          if (uVar49 == 0) {
            uVar45 = 0;
            if (auVar172._0_4_ <= fVar105) {
              auVar278._4_4_ = fVar195;
              auVar278._0_4_ = fVar194;
              auVar278._8_4_ = fVar173;
              auVar278._12_4_ = fVar174;
            }
            else {
              auVar278._4_4_ = fVar195;
              auVar278._0_4_ = fVar194;
              auVar278._8_4_ = fVar173;
              auVar278._12_4_ = fVar174;
              if (fVar89 < fVar144) {
                iVar43 = -(uint)(fVar145 < fStack_53c);
                uVar45 = (ulong)CONCAT11((char)((uint)iVar43 >> 8),
                                         (byte)iVar43 & fVar262 < auVar172._4_4_);
              }
            }
            if ((byte)((3 < (uint)uVar46 || fVar88 < 0.001) | (byte)uVar45) == 1) {
              lVar40 = 200;
              do {
                fVar89 = 1.0 - local_b8;
                fVar145 = local_b8 * local_b8 * local_b8;
                fVar144 = local_b8 * local_b8 * 3.0 * fVar89;
                fVar88 = fVar89 * fVar89 * fVar89;
                fVar160 = local_b8 * 3.0 * fVar89 * fVar89;
                fVar89 = fVar88 * auVar278._0_4_ +
                         fVar160 * fVar196 + fVar144 * fVar137 + fVar145 * fVar161;
                fVar105 = fVar88 * auVar278._4_4_ +
                          fVar160 * fVar207 + fVar144 * fVar138 + fVar145 * fVar125;
                fVar89 = ((fVar88 * auVar278._8_4_ +
                          fVar160 * fVar139 + fVar144 * fVar106 + fVar145 * fVar55) - fVar89) *
                         local_a8 + fVar89;
                fVar105 = ((fVar88 * auVar278._12_4_ +
                           fVar160 * fVar162 + fVar144 * fVar123 + fVar145 * fVar54) - fVar105) *
                          local_a8 + fVar105;
                local_b8 = local_b8 - (fVar105 * fVar208 + fVar89 * fVar235);
                local_a8 = local_a8 - (fVar105 * fVar217 + fVar89 * fVar237);
                fVar88 = ABS(fVar105);
                if (ABS(fVar105) <= ABS(fVar89)) {
                  fVar88 = ABS(fVar89);
                }
                if (fVar88 < fVar124) {
                  if ((((0.0 <= local_b8) && (local_b8 <= 1.0)) && (0.0 <= local_a8)) &&
                     (local_a8 <= 1.0)) {
                    fVar88 = pre->ray_space[k].vx.field_0.m128[2];
                    fVar89 = pre->ray_space[k].vy.field_0.m128[2];
                    fVar105 = pre->ray_space[k].vz.field_0.m128[2];
                    fVar209 = 1.0 - local_a8;
                    fVar208 = 1.0 - local_b8;
                    fVar144 = fVar208 * fVar208 * fVar208;
                    fVar145 = local_b8 * 3.0 * fVar208 * fVar208;
                    fVar175 = local_b8 * local_b8 * local_b8;
                    fVar160 = local_b8 * local_b8 * 3.0 * fVar208;
                    fVar88 = ((fStack_140 * fVar105 + fStack_144 * fVar89 + local_148 * fVar88) *
                              fVar209 +
                             (fStack_180 * fVar105 + fStack_184 * fVar89 + local_188 * fVar88) *
                             local_a8) * fVar144 +
                             ((fStack_150 * fVar105 + fStack_154 * fVar89 + local_158 * fVar88) *
                              fVar209 +
                             (fStack_190 * fVar105 + fStack_194 * fVar89 + local_198 * fVar88) *
                             local_a8) * fVar145 +
                             ((fStack_160 * fVar105 + fStack_164 * fVar89 + local_168 * fVar88) *
                              fVar209 +
                             (fStack_1a0 * fVar105 + fStack_1a4 * fVar89 + local_1a8 * fVar88) *
                             local_a8) * fVar160 +
                             (fVar209 * (fStack_170 * fVar105 +
                                        fStack_174 * fVar89 + local_178 * fVar88) +
                             (fVar105 * fStack_1b0 + fVar89 * fStack_1b4 + fVar88 * local_1b8) *
                             local_a8) * fVar175;
                    if ((fVar87 <= fVar88) &&
                       (fVar89 = *(float *)(ray + k * 4 + 0x80), fVar88 <= fVar89)) {
                      fVar217 = 1.0 - local_a8;
                      fVar235 = 1.0 - local_a8;
                      fVar237 = 1.0 - local_a8;
                      fVar105 = local_408 * fVar217 + local_278 * local_a8;
                      fVar209 = fStack_404 * fVar235 + fStack_274 * local_a8;
                      fVar216 = fStack_400 * fVar237 + fStack_270 * local_a8;
                      fVar223 = local_428 * fVar217 + fVar223 * local_a8;
                      fVar239 = fStack_424 * fVar235 + fVar226 * local_a8;
                      fVar247 = fStack_420 * fVar237 + fVar146 * local_a8;
                      fVar226 = fVar223 - fVar105;
                      fVar241 = fVar239 - fVar209;
                      fVar249 = fVar247 - fVar216;
                      fVar105 = (((fVar105 - (local_3f8 * fVar217 + local_3e8 * local_a8)) * fVar208
                                 + local_b8 * fVar226) * fVar208 +
                                (fVar226 * fVar208 +
                                ((fVar217 * local_418 + fVar90 * local_a8) - fVar223) * local_b8) *
                                local_b8) * 3.0;
                      fVar209 = (((fVar209 - (fStack_3f4 * fVar235 + fStack_3e4 * local_a8)) *
                                  fVar208 + local_b8 * fVar241) * fVar208 +
                                (fVar241 * fVar208 +
                                ((fVar235 * fStack_414 + fVar91 * local_a8) - fVar239) * local_b8) *
                                local_b8) * 3.0;
                      fVar208 = (((fVar216 - (fStack_3f0 * fVar237 + fStack_3e0 * local_a8)) *
                                  fVar208 + local_b8 * fVar249) * fVar208 +
                                (fVar249 * fVar208 +
                                ((fVar237 * fStack_410 + fVar104 * local_a8) - fVar247) * local_b8)
                                * local_b8) * 3.0;
                      pGVar7 = (context->scene->geometries).items[uVar48].ptr;
                      if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        bVar47 = false;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar47 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0))
                      {
                        fVar216 = fVar144 * local_298 +
                                  fVar145 * local_2a8 + fVar160 * local_2b8 + fVar175 * local_2c8;
                        fVar217 = fVar144 * fStack_294 +
                                  fVar145 * fStack_2a4 + fVar160 * fStack_2b4 + fVar175 * fStack_2c4
                        ;
                        fVar144 = fVar144 * fStack_290 +
                                  fVar145 * fStack_2a0 + fVar160 * fStack_2b0 + fVar175 * fStack_2c0
                        ;
                        local_c8 = fVar217 * fVar105 - fVar209 * fVar216;
                        local_e8 = fVar144 * fVar209 - fVar208 * fVar217;
                        local_d8 = fVar216 * fVar208 - fVar105 * fVar144;
                        fStack_e4 = local_e8;
                        fStack_e0 = local_e8;
                        fStack_dc = local_e8;
                        fStack_d4 = local_d8;
                        fStack_d0 = local_d8;
                        fStack_cc = local_d8;
                        fStack_c4 = local_c8;
                        fStack_c0 = local_c8;
                        fStack_bc = local_c8;
                        fStack_b4 = local_b8;
                        fStack_b0 = local_b8;
                        fStack_ac = local_b8;
                        fStack_a4 = local_a8;
                        fStack_a0 = local_a8;
                        fStack_9c = local_a8;
                        local_98 = CONCAT44(uStack_2e4,local_2e8);
                        uStack_90 = CONCAT44(uStack_2dc,uStack_2e0);
                        local_88 = CONCAT44(uStack_2d4,local_2d8);
                        uStack_80 = CONCAT44(uStack_2cc,uStack_2d0);
                        local_78 = context->user->instID[0];
                        uStack_74 = local_78;
                        uStack_70 = local_78;
                        uStack_6c = local_78;
                        local_68 = context->user->instPrimID[0];
                        uStack_64 = local_68;
                        uStack_60 = local_68;
                        uStack_5c = local_68;
                        *(float *)(ray + k * 4 + 0x80) = fVar88;
                        local_448 = *local_438;
                        uStack_440 = local_438[1];
                        local_318.valid = (int *)&local_448;
                        local_318.geometryUserPtr = pGVar7->userPtr;
                        local_318.context = context->user;
                        local_318.ray = (RTCRayN *)ray;
                        local_318.hit = (RTCHitN *)&local_e8;
                        local_318.N = 4;
                        p_Var41 = pGVar7->occlusionFilterN;
                        if (p_Var41 != (RTCFilterFunctionN)0x0) {
                          p_Var41 = (RTCFilterFunctionN)(*p_Var41)(&local_318);
                        }
                        auVar83._0_4_ = -(uint)((int)local_448 == 0);
                        auVar83._4_4_ = -(uint)(local_448._4_4_ == 0);
                        auVar83._8_4_ = -(uint)((int)uStack_440 == 0);
                        auVar83._12_4_ = -(uint)(uStack_440._4_4_ == 0);
                        uVar49 = movmskps((int)p_Var41,auVar83);
                        pRVar42 = (RTCRayN *)(ulong)(uVar49 ^ 0xf);
                        if ((uVar49 ^ 0xf) == 0) {
                          auVar83 = auVar83 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var41 = context->args->filter;
                          if ((p_Var41 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var41)(&local_318);
                          }
                          auVar102._0_4_ = -(uint)((int)local_448 == 0);
                          auVar102._4_4_ = -(uint)(local_448._4_4_ == 0);
                          auVar102._8_4_ = -(uint)((int)uStack_440 == 0);
                          auVar102._12_4_ = -(uint)(uStack_440._4_4_ == 0);
                          auVar83 = auVar102 ^ _DAT_01febe20;
                          *(undefined1 (*) [16])(local_318.ray + 0x80) =
                               ~auVar102 & _DAT_01feba00 |
                               *(undefined1 (*) [16])(local_318.ray + 0x80) & auVar102;
                          pRVar42 = local_318.ray;
                        }
                        auVar84._0_4_ = auVar83._0_4_ << 0x1f;
                        auVar84._4_4_ = auVar83._4_4_ << 0x1f;
                        auVar84._8_4_ = auVar83._8_4_ << 0x1f;
                        auVar84._12_4_ = auVar83._12_4_ << 0x1f;
                        iVar43 = movmskps((int)pRVar42,auVar84);
                        if (iVar43 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar89;
                        }
                        bVar47 = (char)iVar43 != '\0';
                      }
                      local_54c = (uint)((byte)local_54c | bVar47);
                      uVar45 = (ulong)local_54c;
                    }
                  }
                  break;
                }
                lVar40 = lVar40 + -1;
              } while (lVar40 != 0);
            }
            else {
              bVar18 = false;
            }
          }
        }
      }
    } while (bVar18);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }